

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  uint uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  int iVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  long lVar73;
  long lVar74;
  Geometry *pGVar75;
  long lVar76;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar77;
  undefined8 unaff_R13;
  ulong uVar78;
  long lVar79;
  size_t sVar80;
  byte bVar81;
  ulong uVar82;
  ulong uVar83;
  float fVar84;
  float fVar85;
  float fVar129;
  float fVar131;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar88 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar89 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar135;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar150;
  float fVar151;
  undefined1 auVar136 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined4 uVar152;
  undefined1 auVar153 [32];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar162;
  undefined1 auVar166 [16];
  float fVar163;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 in_ZMM25 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_610 [16];
  Primitive *local_5f8;
  ulong local_5f0;
  int local_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  RTCFilterFunctionNArguments local_5a0;
  undefined1 local_570 [16];
  size_t local_560;
  Precalculations *local_558;
  ulong local_550;
  long local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar69 = (ulong)(byte)prim[1];
  fVar154 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar136 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar88 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar161 = fVar154 * auVar88._0_4_;
  fVar135 = fVar154 * auVar136._0_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar86);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar87);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar95 = vpmovsxbd_avx2(auVar5);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar104 = vpmovsxbd_avx2(auVar6);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar98 = vpmovsxbd_avx2(auVar7);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar97 = vpmovsxbd_avx2(auVar8);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar103 = vpmovsxbd_avx2(auVar9);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar102 = vpmovsxbd_avx2(auVar10);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar100 = vpmovsxbd_avx2(auVar11);
  auVar99 = vcvtdq2ps_avx(auVar100);
  auVar203._4_4_ = fVar135;
  auVar203._0_4_ = fVar135;
  auVar203._8_4_ = fVar135;
  auVar203._12_4_ = fVar135;
  auVar203._16_4_ = fVar135;
  auVar203._20_4_ = fVar135;
  auVar203._24_4_ = fVar135;
  auVar203._28_4_ = fVar135;
  auVar205._8_4_ = 1;
  auVar205._0_8_ = 0x100000001;
  auVar205._12_4_ = 1;
  auVar205._16_4_ = 1;
  auVar205._20_4_ = 1;
  auVar205._24_4_ = 1;
  auVar205._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar209 = ZEXT3264(auVar90);
  auVar93 = ZEXT1632(CONCAT412(fVar154 * auVar136._12_4_,
                               CONCAT48(fVar154 * auVar136._8_4_,
                                        CONCAT44(fVar154 * auVar136._4_4_,fVar135))));
  auVar92 = vpermps_avx2(auVar205,auVar93);
  auVar91 = vpermps_avx512vl(auVar90,auVar93);
  fVar135 = auVar91._0_4_;
  auVar211._0_4_ = fVar135 * auVar95._0_4_;
  fVar150 = auVar91._4_4_;
  auVar211._4_4_ = fVar150 * auVar95._4_4_;
  fVar151 = auVar91._8_4_;
  auVar211._8_4_ = fVar151 * auVar95._8_4_;
  fVar163 = auVar91._12_4_;
  auVar211._12_4_ = fVar163 * auVar95._12_4_;
  fVar162 = auVar91._16_4_;
  auVar211._16_4_ = fVar162 * auVar95._16_4_;
  fVar175 = auVar91._20_4_;
  auVar211._20_4_ = fVar175 * auVar95._20_4_;
  fVar176 = auVar91._24_4_;
  auVar211._28_36_ = in_ZMM4._28_36_;
  auVar211._24_4_ = fVar176 * auVar95._24_4_;
  auVar93._4_4_ = auVar97._4_4_ * fVar150;
  auVar93._0_4_ = auVar97._0_4_ * fVar135;
  auVar93._8_4_ = auVar97._8_4_ * fVar151;
  auVar93._12_4_ = auVar97._12_4_ * fVar163;
  auVar93._16_4_ = auVar97._16_4_ * fVar162;
  auVar93._20_4_ = auVar97._20_4_ * fVar175;
  auVar93._24_4_ = auVar97._24_4_ * fVar176;
  auVar93._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar99._4_4_ * fVar150;
  auVar100._0_4_ = auVar99._0_4_ * fVar135;
  auVar100._8_4_ = auVar99._8_4_ * fVar151;
  auVar100._12_4_ = auVar99._12_4_ * fVar163;
  auVar100._16_4_ = auVar99._16_4_ * fVar162;
  auVar100._20_4_ = auVar99._20_4_ * fVar175;
  auVar100._24_4_ = auVar99._24_4_ * fVar176;
  auVar100._28_4_ = auVar91._28_4_;
  auVar86 = vfmadd231ps_fma(auVar211._0_32_,auVar92,auVar94);
  auVar87 = vfmadd231ps_fma(auVar93,auVar92,auVar98);
  auVar5 = vfmadd231ps_fma(auVar100,auVar102,auVar92);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar203,auVar96);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar203,auVar104);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar103,auVar203);
  auVar204._4_4_ = fVar161;
  auVar204._0_4_ = fVar161;
  auVar204._8_4_ = fVar161;
  auVar204._12_4_ = fVar161;
  auVar204._16_4_ = fVar161;
  auVar204._20_4_ = fVar161;
  auVar204._24_4_ = fVar161;
  auVar204._28_4_ = fVar161;
  auVar92 = ZEXT1632(CONCAT412(fVar154 * auVar88._12_4_,
                               CONCAT48(fVar154 * auVar88._8_4_,
                                        CONCAT44(fVar154 * auVar88._4_4_,fVar161))));
  auVar100 = vpermps_avx2(auVar205,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  auVar93 = vmulps_avx512vl(auVar92,auVar95);
  auVar170._0_4_ = auVar92._0_4_ * auVar97._0_4_;
  auVar170._4_4_ = auVar92._4_4_ * auVar97._4_4_;
  auVar170._8_4_ = auVar92._8_4_ * auVar97._8_4_;
  auVar170._12_4_ = auVar92._12_4_ * auVar97._12_4_;
  auVar170._16_4_ = auVar92._16_4_ * auVar97._16_4_;
  auVar170._20_4_ = auVar92._20_4_ * auVar97._20_4_;
  auVar170._24_4_ = auVar92._24_4_ * auVar97._24_4_;
  auVar170._28_4_ = 0;
  auVar97._4_4_ = auVar92._4_4_ * auVar99._4_4_;
  auVar97._0_4_ = auVar92._0_4_ * auVar99._0_4_;
  auVar97._8_4_ = auVar92._8_4_ * auVar99._8_4_;
  auVar97._12_4_ = auVar92._12_4_ * auVar99._12_4_;
  auVar97._16_4_ = auVar92._16_4_ * auVar99._16_4_;
  auVar97._20_4_ = auVar92._20_4_ * auVar99._20_4_;
  auVar97._24_4_ = auVar92._24_4_ * auVar99._24_4_;
  auVar97._28_4_ = auVar95._28_4_;
  auVar94 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar94);
  auVar6 = vfmadd231ps_fma(auVar170,auVar100,auVar98);
  auVar7 = vfmadd231ps_fma(auVar97,auVar100,auVar102);
  auVar94 = vfmadd231ps_avx512vl(auVar94,auVar204,auVar96);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar204,auVar104);
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar192._16_4_ = 0x7fffffff;
  auVar192._20_4_ = 0x7fffffff;
  auVar192._24_4_ = 0x7fffffff;
  auVar192._28_4_ = 0x7fffffff;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar204,auVar103);
  auVar96 = vandps_avx(ZEXT1632(auVar86),auVar192);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar190._16_4_ = 0x219392ef;
  auVar190._20_4_ = 0x219392ef;
  auVar190._24_4_ = 0x219392ef;
  auVar190._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar96,auVar190,1);
  bVar14 = (bool)((byte)uVar78 & 1);
  auVar92._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._0_4_;
  bVar14 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._4_4_;
  bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._8_4_;
  bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar86._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar87),auVar192);
  uVar78 = vcmpps_avx512vl(auVar96,auVar190,1);
  bVar14 = (bool)((byte)uVar78 & 1);
  auVar90._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._0_4_;
  bVar14 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._4_4_;
  bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._8_4_;
  bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar87._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar5),auVar192);
  uVar78 = vcmpps_avx512vl(auVar96,auVar190,1);
  bVar14 = (bool)((byte)uVar78 & 1);
  auVar96._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar5._0_4_;
  bVar14 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar5._4_4_;
  bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar5._8_4_;
  bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar5._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar92);
  auVar191._8_4_ = 0x3f800000;
  auVar191._0_8_ = 0x3f8000003f800000;
  auVar191._12_4_ = 0x3f800000;
  auVar191._16_4_ = 0x3f800000;
  auVar191._20_4_ = 0x3f800000;
  auVar191._24_4_ = 0x3f800000;
  auVar191._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar92,auVar95,auVar191);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar90);
  auVar87 = vfnmadd213ps_fma(auVar90,auVar95,auVar191);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar96);
  auVar5 = vfnmadd213ps_fma(auVar96,auVar95,auVar191);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar95,auVar95);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx512vl(auVar96,auVar94);
  auVar103._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar103._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar103._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar103._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar103._16_4_ = auVar96._16_4_ * 0.0;
  auVar103._20_4_ = auVar96._20_4_ * 0.0;
  auVar103._24_4_ = auVar96._24_4_ * 0.0;
  auVar103._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx512vl(auVar96,auVar94);
  auVar178._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar178._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar178._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar178._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar178._16_4_ = auVar96._16_4_ * 0.0;
  auVar178._20_4_ = auVar96._20_4_ * 0.0;
  auVar178._24_4_ = auVar96._24_4_ * 0.0;
  auVar178._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar6));
  auVar102._4_4_ = auVar87._4_4_ * auVar96._4_4_;
  auVar102._0_4_ = auVar87._0_4_ * auVar96._0_4_;
  auVar102._8_4_ = auVar87._8_4_ * auVar96._8_4_;
  auVar102._12_4_ = auVar87._12_4_ * auVar96._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar97 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar6));
  auVar101._0_4_ = auVar87._0_4_ * auVar96._0_4_;
  auVar101._4_4_ = auVar87._4_4_ * auVar96._4_4_;
  auVar101._8_4_ = auVar87._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar87._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar7));
  auVar99._4_4_ = auVar96._4_4_ * auVar5._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar5._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar5._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar5._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * 0.0;
  auVar99._20_4_ = auVar96._20_4_ * 0.0;
  auVar99._24_4_ = auVar96._24_4_ * 0.0;
  auVar99._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar7));
  auVar91._0_4_ = auVar5._0_4_ * auVar96._0_4_;
  auVar91._4_4_ = auVar5._4_4_ * auVar96._4_4_;
  auVar91._8_4_ = auVar5._8_4_ * auVar96._8_4_;
  auVar91._12_4_ = auVar5._12_4_ * auVar96._12_4_;
  auVar91._16_4_ = auVar96._16_4_ * 0.0;
  auVar91._20_4_ = auVar96._20_4_ * 0.0;
  auVar91._24_4_ = auVar96._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar103,auVar178);
  auVar94 = vpminsd_avx2(auVar102,auVar101);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar99,auVar91);
  uVar152 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar95._4_4_ = uVar152;
  auVar95._0_4_ = uVar152;
  auVar95._8_4_ = uVar152;
  auVar95._12_4_ = uVar152;
  auVar95._16_4_ = uVar152;
  auVar95._20_4_ = uVar152;
  auVar95._24_4_ = uVar152;
  auVar95._28_4_ = uVar152;
  auVar94 = vmaxps_avx512vl(auVar94,auVar95);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar103,auVar178);
  auVar94 = vpmaxsd_avx2(auVar102,auVar101);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar99,auVar91);
  uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar104._4_4_ = uVar152;
  auVar104._0_4_ = uVar152;
  auVar104._8_4_ = uVar152;
  auVar104._12_4_ = uVar152;
  auVar104._16_4_ = uVar152;
  auVar104._20_4_ = uVar152;
  auVar104._24_4_ = uVar152;
  auVar104._28_4_ = uVar152;
  auVar94 = vminps_avx512vl(auVar94,auVar104);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar98);
  uVar20 = vcmpps_avx512vl(local_80,auVar96,2);
  uVar21 = vpcmpgtd_avx512vl(auVar97,_DAT_01fb4ba0);
  uVar78 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar20 & (byte)uVar21));
  local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar211 = ZEXT1664(auVar86);
  sVar80 = k;
  local_5f8 = prim;
  local_560 = k;
  local_558 = pre;
  do {
    if (uVar78 == 0) {
      return;
    }
    lVar76 = 0;
    for (uVar69 = uVar78; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar76 = lVar76 + 1;
    }
    uVar71 = *(uint *)(prim + 2);
    local_5f0 = (ulong)uVar71;
    uVar72 = *(uint *)(prim + lVar76 * 4 + 6);
    local_550 = (ulong)uVar72;
    pGVar75 = (context->scene->geometries).items[local_5f0].ptr;
    lVar76 = *(long *)&pGVar75[1].time_range.upper;
    uVar69 = (ulong)*(uint *)(*(long *)&pGVar75->field_0x58 +
                             local_550 *
                             pGVar75[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar73 = (long)pGVar75[1].intersectionFilterN * uVar69;
    local_5b0 = *(undefined1 (*) [16])(lVar76 + lVar73);
    lVar74 = (long)pGVar75[1].intersectionFilterN * (uVar69 + 1);
    _local_5c0 = *(undefined1 (*) [16])(lVar76 + lVar74);
    auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar80 * 4)),
                            ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x10)),0x1c);
    auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x20)),0x28);
    iVar77 = (int)pGVar75[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar136._8_4_ = 0xbeaaaaab;
    auVar136._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar136._12_4_ = 0xbeaaaaab;
    local_5d0 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar75[2].intersectionFilterN +
                                  uVar69 * (long)pGVar75[2].pointQueryFunc),local_5b0,auVar136);
    local_5e0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar75[2].intersectionFilterN +
                                 (long)pGVar75[2].pointQueryFunc * (uVar69 + 1)),_local_5c0,auVar136
                               );
    auVar5 = vsubps_avx(local_5b0,auVar86);
    uVar152 = auVar5._0_4_;
    auVar164._4_4_ = uVar152;
    auVar164._0_4_ = uVar152;
    auVar164._8_4_ = uVar152;
    auVar164._12_4_ = uVar152;
    auVar87 = vshufps_avx(auVar5,auVar5,0x55);
    aVar3 = pre->ray_space[k].vx.field_0;
    aVar4 = pre->ray_space[k].vy.field_0;
    auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
    fVar154 = pre->ray_space[k].vz.field_0.m128[0];
    fVar135 = pre->ray_space[k].vz.field_0.m128[1];
    fVar150 = pre->ray_space[k].vz.field_0.m128[2];
    fVar151 = pre->ray_space[k].vz.field_0.m128[3];
    auVar195._0_4_ = fVar154 * auVar5._0_4_;
    auVar195._4_4_ = fVar135 * auVar5._4_4_;
    auVar195._8_4_ = fVar150 * auVar5._8_4_;
    auVar195._12_4_ = fVar151 * auVar5._12_4_;
    auVar87 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar4,auVar87);
    auVar6 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar164);
    auVar5 = vsubps_avx(local_5d0,auVar86);
    uVar152 = auVar5._0_4_;
    auVar165._4_4_ = uVar152;
    auVar165._0_4_ = uVar152;
    auVar165._8_4_ = uVar152;
    auVar165._12_4_ = uVar152;
    auVar87 = vshufps_avx(auVar5,auVar5,0x55);
    auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
    auVar196._0_4_ = fVar154 * auVar5._0_4_;
    auVar196._4_4_ = fVar135 * auVar5._4_4_;
    auVar196._8_4_ = fVar150 * auVar5._8_4_;
    auVar196._12_4_ = fVar151 * auVar5._12_4_;
    auVar87 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar4,auVar87);
    auVar7 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar165);
    auVar5 = vsubps_avx(local_5e0,auVar86);
    uVar152 = auVar5._0_4_;
    auVar89._4_4_ = uVar152;
    auVar89._0_4_ = uVar152;
    auVar89._8_4_ = uVar152;
    auVar89._12_4_ = uVar152;
    auVar87 = vshufps_avx(auVar5,auVar5,0x55);
    auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
    auVar198._0_4_ = fVar154 * auVar5._0_4_;
    auVar198._4_4_ = fVar135 * auVar5._4_4_;
    auVar198._8_4_ = fVar150 * auVar5._8_4_;
    auVar198._12_4_ = fVar151 * auVar5._12_4_;
    auVar87 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar4,auVar87);
    auVar5 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar89);
    auVar87 = vsubps_avx(_local_5c0,auVar86);
    uVar152 = auVar87._0_4_;
    auVar88._4_4_ = uVar152;
    auVar88._0_4_ = uVar152;
    auVar88._8_4_ = uVar152;
    auVar88._12_4_ = uVar152;
    auVar86 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar202._0_4_ = fVar154 * auVar87._0_4_;
    auVar202._4_4_ = fVar135 * auVar87._4_4_;
    auVar202._8_4_ = fVar150 * auVar87._8_4_;
    auVar202._12_4_ = fVar151 * auVar87._12_4_;
    auVar86 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar4,auVar86);
    local_548 = (long)iVar77;
    lVar79 = local_548 * 0x44;
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar79);
    auVar8 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar3,auVar88);
    uVar152 = auVar6._0_4_;
    local_2e0._4_4_ = uVar152;
    local_2e0._0_4_ = uVar152;
    local_2e0._8_4_ = uVar152;
    local_2e0._12_4_ = uVar152;
    local_2e0._16_4_ = uVar152;
    local_2e0._20_4_ = uVar152;
    local_2e0._24_4_ = uVar152;
    local_2e0._28_4_ = uVar152;
    auVar141._8_4_ = 1;
    auVar141._0_8_ = 0x100000001;
    auVar141._12_4_ = 1;
    auVar141._16_4_ = 1;
    auVar141._20_4_ = 1;
    auVar141._24_4_ = 1;
    auVar141._28_4_ = 1;
    local_300 = vpermps_avx2(auVar141,ZEXT1632(auVar6));
    auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x484);
    local_320 = vbroadcastss_avx512vl(auVar7);
    local_340 = vpermps_avx512vl(auVar141,ZEXT1632(auVar7));
    auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar5);
    auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0xd8c);
    local_380 = vpermps_avx512vl(auVar141,ZEXT1632(auVar5));
    uVar152 = auVar8._0_4_;
    local_3a0._4_4_ = uVar152;
    local_3a0._0_4_ = uVar152;
    fStack_398 = (float)uVar152;
    fStack_394 = (float)uVar152;
    fStack_390 = (float)uVar152;
    fStack_38c = (float)uVar152;
    fStack_388 = (float)uVar152;
    register0x0000139c = uVar152;
    _local_3c0 = vpermps_avx512vl(auVar141,ZEXT1632(auVar8));
    auVar98 = vmulps_avx512vl(_local_3a0,auVar104);
    auVar97 = vmulps_avx512vl(_local_3c0,auVar104);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_360);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_380);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar97,auVar94,local_340);
    auVar9 = vfmadd231ps_fma(auVar98,auVar96,local_2e0);
    auVar188 = ZEXT1664(auVar9);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar79);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x484);
    auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x908);
    auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0xd8c);
    auVar10 = vfmadd231ps_fma(auVar99,auVar96,local_300);
    auVar183 = ZEXT1664(auVar10);
    auVar99 = vmulps_avx512vl(_local_3a0,auVar102);
    auVar100 = vmulps_avx512vl(_local_3c0,auVar102);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_360);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_380);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_320);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_340);
    auVar11 = vfmadd231ps_fma(auVar99,auVar98,local_2e0);
    auVar193 = ZEXT1664(auVar11);
    auVar136 = vfmadd231ps_fma(auVar100,auVar98,local_300);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar9));
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar136),ZEXT1632(auVar10));
    auVar92 = vmulps_avx512vl(ZEXT1632(auVar10),auVar99);
    auVar93 = vmulps_avx512vl(ZEXT1632(auVar9),auVar100);
    auVar92 = vsubps_avx512vl(auVar92,auVar93);
    auVar86 = vshufps_avx(local_5d0,local_5d0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx(local_5e0,local_5e0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar86);
    local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar76 + 0xc + lVar74)));
    auVar93 = vmulps_avx512vl(local_e0,auVar104);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,local_c0);
    local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar76 + 0xc + lVar73)));
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,local_a0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_100);
    auVar90 = vmulps_avx512vl(local_e0,auVar102);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_c0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,local_a0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,local_100);
    auVar91 = vmulps_avx512vl(auVar100,auVar100);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar99);
    auVar101 = vmaxps_avx512vl(auVar93,auVar90);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar91 = vmulps_avx512vl(auVar101,auVar91);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    uVar20 = vcmpps_avx512vl(auVar92,auVar91,2);
    auVar86 = vinsertps_avx512f(auVar6,local_100._0_16_,0x30);
    auVar164 = auVar211._0_16_;
    auVar87 = vandps_avx512vl(auVar86,auVar164);
    auVar86 = vblendps_avx(auVar7,local_5d0,8);
    auVar86 = vandps_avx512vl(auVar86,auVar164);
    auVar87 = vmaxps_avx512vl(auVar87,auVar86);
    auVar86 = vblendps_avx(auVar5,local_5e0,8);
    auVar88 = vandps_avx512vl(auVar86,auVar164);
    auVar86 = vinsertps_avx512f(auVar8,local_e0._0_16_,0x30);
    auVar86 = vandps_avx512vl(auVar86,auVar164);
    auVar86 = vmaxps_avx512vl(auVar88,auVar86);
    auVar86 = vmaxps_avx(auVar87,auVar86);
    auVar87 = vmovshdup_avx(auVar86);
    auVar87 = vmaxss_avx(auVar87,auVar86);
    auVar86 = vshufpd_avx(auVar86,auVar86,1);
    auVar86 = vmaxss_avx(auVar86,auVar87);
    auVar87 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar77);
    local_520._0_16_ = auVar87;
    auVar200._0_4_ = auVar87._0_4_;
    auVar200._4_4_ = auVar200._0_4_;
    auVar200._8_4_ = auVar200._0_4_;
    auVar200._12_4_ = auVar200._0_4_;
    auVar200._16_4_ = auVar200._0_4_;
    auVar200._20_4_ = auVar200._0_4_;
    auVar200._24_4_ = auVar200._0_4_;
    auVar200._28_4_ = auVar200._0_4_;
    uVar21 = vcmpps_avx512vl(auVar200,_DAT_01f7b060,0xe);
    bVar81 = (byte)uVar20 & (byte)uVar21;
    fVar154 = auVar86._0_4_ * 4.7683716e-07;
    local_570 = ZEXT416((uint)fVar154);
    auVar92 = auVar209._0_32_;
    local_4c0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar6));
    auVar212 = ZEXT3264(local_4c0);
    local_160 = vpermps_avx512vl(auVar92,ZEXT1632(auVar7));
    local_180 = vpermps_avx512vl(auVar92,ZEXT1632(auVar5));
    local_1a0 = vpermps_avx512vl(auVar92,ZEXT1632(auVar8));
    local_480 = *(undefined4 *)(ray + sVar80 * 4 + 0x30);
    uStack_47c = 0;
    uStack_478 = 0;
    uStack_474 = 0;
    local_4d0 = vpbroadcastd_avx512vl();
    local_4e0 = vpbroadcastd_avx512vl();
    if (bVar81 != 0) {
      in_ZMM25 = ZEXT3264(local_1a0);
      auVar102 = vmulps_avx512vl(local_1a0,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar102);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar103);
      auVar97 = vfmadd213ps_avx512vl(auVar98,local_4c0,auVar97);
      auVar104 = vmulps_avx512vl(local_1a0,auVar104);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_180,auVar104);
      auVar103 = vfmadd213ps_avx512vl(auVar94,local_160,auVar95);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1694);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1f9c);
      auVar103 = vfmadd213ps_avx512vl(auVar96,local_4c0,auVar103);
      auVar96 = vmulps_avx512vl(_local_3a0,auVar98);
      auVar102 = vmulps_avx512vl(_local_3c0,auVar98);
      auVar98 = vmulps_avx512vl(local_1a0,auVar98);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,local_360);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_380);
      auVar104 = vfmadd231ps_avx512vl(auVar98,local_180,auVar104);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar102,auVar95,local_340);
      auVar102 = vfmadd231ps_avx512vl(auVar104,local_160,auVar95);
      auVar92 = vfmadd231ps_avx512vl(auVar96,auVar94,local_2e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_300);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1b18);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1f9c);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_4c0,auVar94);
      auVar94 = vmulps_avx512vl(_local_3a0,auVar104);
      auVar91 = vmulps_avx512vl(_local_3c0,auVar104);
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar211 = ZEXT1664(auVar86);
      auVar104 = vmulps_avx512vl(local_1a0,auVar104);
      auVar101 = vfmadd231ps_avx512vl(auVar94,auVar95,local_360);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,local_380);
      auVar95 = vfmadd231ps_avx512vl(auVar104,local_180,auVar95);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1694);
      auVar104 = vfmadd231ps_avx512vl(auVar101,auVar94,local_320);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar94,local_340);
      auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
      auVar95 = vfmadd231ps_avx512vl(auVar104,auVar96,local_2e0);
      auVar104 = vfmadd231ps_avx512vl(auVar91,auVar96,local_300);
      auVar91 = vfmadd231ps_avx512vl(auVar94,local_4c0,auVar96);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar206._16_4_ = 0x7fffffff;
      auVar206._20_4_ = 0x7fffffff;
      auVar206._24_4_ = 0x7fffffff;
      auVar206._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(auVar92,auVar206);
      auVar94 = vandps_avx(auVar98,auVar206);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar96 = vandps_avx(auVar102,auVar206);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      auVar201._4_4_ = fVar154;
      auVar201._0_4_ = fVar154;
      auVar201._8_4_ = fVar154;
      auVar201._12_4_ = fVar154;
      auVar201._16_4_ = fVar154;
      auVar201._20_4_ = fVar154;
      auVar201._24_4_ = fVar154;
      auVar201._28_4_ = fVar154;
      uVar69 = vcmpps_avx512vl(auVar96,auVar201,1);
      bVar14 = (bool)((byte)uVar69 & 1);
      auVar105._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar92._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar92._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar92._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar92._12_4_);
      bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar92._16_4_);
      bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar92._20_4_);
      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar92._24_4_);
      bVar14 = SUB81(uVar69 >> 7,0);
      auVar105._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar92._28_4_;
      bVar14 = (bool)((byte)uVar69 & 1);
      auVar106._0_4_ = (float)((uint)bVar14 * auVar100._0_4_ | (uint)!bVar14 * auVar98._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar98._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar98._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar98._12_4_);
      bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar14 * auVar100._16_4_ | (uint)!bVar14 * auVar98._16_4_);
      bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar14 * auVar100._20_4_ | (uint)!bVar14 * auVar98._20_4_);
      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar14 * auVar100._24_4_ | (uint)!bVar14 * auVar98._24_4_);
      bVar14 = SUB81(uVar69 >> 7,0);
      auVar106._28_4_ = (uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar98._28_4_;
      vandps_avx512vl(auVar95,auVar206);
      auVar96 = vandps_avx(auVar104,auVar206);
      auVar94 = vmaxps_avx(auVar106,auVar96);
      auVar96 = vandps_avx(auVar91,auVar206);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      uVar69 = vcmpps_avx512vl(auVar96,auVar201,1);
      bVar14 = (bool)((byte)uVar69 & 1);
      auVar107._0_4_ = (uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar95._0_4_;
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar95._4_4_;
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar95._8_4_;
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar95._12_4_;
      bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar95._16_4_;
      bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar95._20_4_;
      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar95._24_4_;
      bVar14 = SUB81(uVar69 >> 7,0);
      auVar107._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar95._28_4_;
      bVar14 = (bool)((byte)uVar69 & 1);
      auVar108._0_4_ = (float)((uint)bVar14 * auVar100._0_4_ | (uint)!bVar14 * auVar104._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar104._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar104._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar104._12_4_);
      bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar14 * auVar100._16_4_ | (uint)!bVar14 * auVar104._16_4_);
      bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar14 * auVar100._20_4_ | (uint)!bVar14 * auVar104._20_4_);
      bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar14 * auVar100._24_4_ | (uint)!bVar14 * auVar104._24_4_);
      bVar14 = SUB81(uVar69 >> 7,0);
      auVar108._28_4_ = (uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar104._28_4_;
      auVar199._8_4_ = 0x80000000;
      auVar199._0_8_ = 0x8000000080000000;
      auVar199._12_4_ = 0x80000000;
      auVar199._16_4_ = 0x80000000;
      auVar199._20_4_ = 0x80000000;
      auVar199._24_4_ = 0x80000000;
      auVar199._28_4_ = 0x80000000;
      auVar96 = vxorps_avx512vl(auVar107,auVar199);
      auVar89 = vxorps_avx512vl(local_300._0_16_,local_300._0_16_);
      auVar94 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar89));
      auVar86 = vfmadd231ps_fma(auVar94,auVar106,auVar106);
      auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
      auVar207._8_4_ = 0xbf000000;
      auVar207._0_8_ = 0xbf000000bf000000;
      auVar207._12_4_ = 0xbf000000;
      auVar207._16_4_ = 0xbf000000;
      auVar207._20_4_ = 0xbf000000;
      auVar207._24_4_ = 0xbf000000;
      auVar207._28_4_ = 0xbf000000;
      fVar135 = auVar94._0_4_;
      fVar150 = auVar94._4_4_;
      fVar151 = auVar94._8_4_;
      fVar163 = auVar94._12_4_;
      fVar162 = auVar94._16_4_;
      fVar175 = auVar94._20_4_;
      fVar176 = auVar94._24_4_;
      auVar32._4_4_ = fVar150 * fVar150 * fVar150 * auVar86._4_4_ * -0.5;
      auVar32._0_4_ = fVar135 * fVar135 * fVar135 * auVar86._0_4_ * -0.5;
      auVar32._8_4_ = fVar151 * fVar151 * fVar151 * auVar86._8_4_ * -0.5;
      auVar32._12_4_ = fVar163 * fVar163 * fVar163 * auVar86._12_4_ * -0.5;
      auVar32._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar32._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar32._24_4_ = fVar176 * fVar176 * fVar176 * -0.0;
      auVar32._28_4_ = 0;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar104 = vfmadd231ps_avx512vl(auVar32,auVar95,auVar94);
      auVar33._4_4_ = auVar106._4_4_ * auVar104._4_4_;
      auVar33._0_4_ = auVar106._0_4_ * auVar104._0_4_;
      auVar33._8_4_ = auVar106._8_4_ * auVar104._8_4_;
      auVar33._12_4_ = auVar106._12_4_ * auVar104._12_4_;
      auVar33._16_4_ = auVar106._16_4_ * auVar104._16_4_;
      auVar33._20_4_ = auVar106._20_4_ * auVar104._20_4_;
      auVar33._24_4_ = auVar106._24_4_ * auVar104._24_4_;
      auVar33._28_4_ = auVar94._28_4_;
      auVar34._4_4_ = auVar104._4_4_ * -auVar105._4_4_;
      auVar34._0_4_ = auVar104._0_4_ * -auVar105._0_4_;
      auVar34._8_4_ = auVar104._8_4_ * -auVar105._8_4_;
      auVar34._12_4_ = auVar104._12_4_ * -auVar105._12_4_;
      auVar34._16_4_ = auVar104._16_4_ * -auVar105._16_4_;
      auVar34._20_4_ = auVar104._20_4_ * -auVar105._20_4_;
      auVar34._24_4_ = auVar104._24_4_ * -auVar105._24_4_;
      auVar34._28_4_ = auVar105._28_4_ ^ 0x80000000;
      auVar104 = vmulps_avx512vl(auVar104,ZEXT1632(auVar89));
      auVar102 = ZEXT1632(auVar89);
      auVar94 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar102);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar108,auVar108);
      auVar98 = vrsqrt14ps_avx512vl(auVar94);
      auVar94 = vmulps_avx512vl(auVar94,auVar207);
      fVar135 = auVar98._0_4_;
      fVar150 = auVar98._4_4_;
      fVar151 = auVar98._8_4_;
      fVar163 = auVar98._12_4_;
      fVar162 = auVar98._16_4_;
      fVar175 = auVar98._20_4_;
      fVar176 = auVar98._24_4_;
      auVar35._4_4_ = fVar150 * fVar150 * fVar150 * auVar94._4_4_;
      auVar35._0_4_ = fVar135 * fVar135 * fVar135 * auVar94._0_4_;
      auVar35._8_4_ = fVar151 * fVar151 * fVar151 * auVar94._8_4_;
      auVar35._12_4_ = fVar163 * fVar163 * fVar163 * auVar94._12_4_;
      auVar35._16_4_ = fVar162 * fVar162 * fVar162 * auVar94._16_4_;
      auVar35._20_4_ = fVar175 * fVar175 * fVar175 * auVar94._20_4_;
      auVar35._24_4_ = fVar176 * fVar176 * fVar176 * auVar94._24_4_;
      auVar35._28_4_ = 0xbf000000;
      auVar95 = vfmadd231ps_avx512vl(auVar35,auVar95,auVar98);
      auVar36._4_4_ = auVar108._4_4_ * auVar95._4_4_;
      auVar36._0_4_ = auVar108._0_4_ * auVar95._0_4_;
      auVar36._8_4_ = auVar108._8_4_ * auVar95._8_4_;
      auVar36._12_4_ = auVar108._12_4_ * auVar95._12_4_;
      auVar36._16_4_ = auVar108._16_4_ * auVar95._16_4_;
      auVar36._20_4_ = auVar108._20_4_ * auVar95._20_4_;
      auVar36._24_4_ = auVar108._24_4_ * auVar95._24_4_;
      auVar36._28_4_ = auVar98._28_4_;
      auVar37._4_4_ = auVar95._4_4_ * auVar96._4_4_;
      auVar37._0_4_ = auVar95._0_4_ * auVar96._0_4_;
      auVar37._8_4_ = auVar95._8_4_ * auVar96._8_4_;
      auVar37._12_4_ = auVar95._12_4_ * auVar96._12_4_;
      auVar37._16_4_ = auVar95._16_4_ * auVar96._16_4_;
      auVar37._20_4_ = auVar95._20_4_ * auVar96._20_4_;
      auVar37._24_4_ = auVar95._24_4_ * auVar96._24_4_;
      auVar37._28_4_ = auVar94._28_4_;
      auVar96 = vmulps_avx512vl(auVar95,auVar102);
      auVar86 = vfmadd213ps_fma(auVar33,auVar93,ZEXT1632(auVar9));
      auVar87 = vfmadd213ps_fma(auVar34,auVar93,ZEXT1632(auVar10));
      auVar95 = vfmadd213ps_avx512vl(auVar104,auVar93,auVar103);
      auVar98 = vfmadd213ps_avx512vl(auVar36,auVar90,ZEXT1632(auVar11));
      auVar88 = vfnmadd213ps_fma(auVar33,auVar93,ZEXT1632(auVar9));
      auVar5 = vfmadd213ps_fma(auVar37,auVar90,ZEXT1632(auVar136));
      auVar10 = vfnmadd213ps_fma(auVar34,auVar93,ZEXT1632(auVar10));
      auVar6 = vfmadd213ps_fma(auVar96,auVar90,auVar97);
      auVar164 = vfnmadd231ps_fma(auVar103,auVar93,auVar104);
      auVar11 = vfnmadd213ps_fma(auVar36,auVar90,ZEXT1632(auVar11));
      auVar136 = vfnmadd213ps_fma(auVar37,auVar90,ZEXT1632(auVar136));
      auVar165 = vfnmadd231ps_fma(auVar97,auVar90,auVar96);
      auVar97 = vsubps_avx512vl(auVar98,ZEXT1632(auVar88));
      auVar96 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar10));
      auVar94 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar164));
      auVar38._4_4_ = auVar96._4_4_ * auVar164._4_4_;
      auVar38._0_4_ = auVar96._0_4_ * auVar164._0_4_;
      auVar38._8_4_ = auVar96._8_4_ * auVar164._8_4_;
      auVar38._12_4_ = auVar96._12_4_ * auVar164._12_4_;
      auVar38._16_4_ = auVar96._16_4_ * 0.0;
      auVar38._20_4_ = auVar96._20_4_ * 0.0;
      auVar38._24_4_ = auVar96._24_4_ * 0.0;
      auVar38._28_4_ = auVar104._28_4_;
      auVar7 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar10),auVar94);
      auVar39._4_4_ = auVar94._4_4_ * auVar88._4_4_;
      auVar39._0_4_ = auVar94._0_4_ * auVar88._0_4_;
      auVar39._8_4_ = auVar94._8_4_ * auVar88._8_4_;
      auVar39._12_4_ = auVar94._12_4_ * auVar88._12_4_;
      auVar39._16_4_ = auVar94._16_4_ * 0.0;
      auVar39._20_4_ = auVar94._20_4_ * 0.0;
      auVar39._24_4_ = auVar94._24_4_ * 0.0;
      auVar39._28_4_ = auVar94._28_4_;
      auVar8 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar164),auVar97);
      auVar40._4_4_ = auVar10._4_4_ * auVar97._4_4_;
      auVar40._0_4_ = auVar10._0_4_ * auVar97._0_4_;
      auVar40._8_4_ = auVar10._8_4_ * auVar97._8_4_;
      auVar40._12_4_ = auVar10._12_4_ * auVar97._12_4_;
      auVar40._16_4_ = auVar97._16_4_ * 0.0;
      auVar40._20_4_ = auVar97._20_4_ * 0.0;
      auVar40._24_4_ = auVar97._24_4_ * 0.0;
      auVar40._28_4_ = auVar97._28_4_;
      auVar9 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar88),auVar96);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar102,ZEXT1632(auVar8));
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,ZEXT1632(auVar7));
      auVar91 = ZEXT1632(auVar89);
      uVar69 = vcmpps_avx512vl(auVar96,auVar91,2);
      bVar68 = (byte)uVar69;
      fVar84 = (float)((uint)(bVar68 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar11._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar129 = (float)((uint)bVar14 * auVar86._4_4_ | (uint)!bVar14 * auVar11._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar131 = (float)((uint)bVar14 * auVar86._8_4_ | (uint)!bVar14 * auVar11._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar133 = (float)((uint)bVar14 * auVar86._12_4_ | (uint)!bVar14 * auVar11._12_4_);
      auVar103 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar84))));
      fVar85 = (float)((uint)(bVar68 & 1) * auVar87._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar136._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar130 = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar136._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar132 = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar136._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar134 = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar136._12_4_);
      auVar102 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar85))));
      auVar109._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar165._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar165._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar165._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar165._12_4_);
      fVar135 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar95._16_4_);
      auVar109._16_4_ = fVar135;
      fVar150 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar95._20_4_);
      auVar109._20_4_ = fVar150;
      fVar151 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar95._24_4_);
      auVar109._24_4_ = fVar151;
      iVar1 = (uint)(byte)(uVar69 >> 7) * auVar95._28_4_;
      auVar109._28_4_ = iVar1;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar98);
      auVar110._0_4_ =
           (uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar86._0_4_;
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar86._4_4_;
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar86._8_4_;
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar86._12_4_;
      auVar110._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_;
      auVar110._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_;
      auVar110._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_;
      auVar110._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar5));
      auVar111._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar7._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar7._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar7._12_4_);
      fVar175 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
      auVar111._16_4_ = fVar175;
      fVar162 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
      auVar111._20_4_ = fVar162;
      fVar163 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
      auVar111._24_4_ = fVar163;
      auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar164),ZEXT1632(auVar6));
      auVar112._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar87._0_4_);
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar87._4_4_);
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar87._8_4_);
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar87._12_4_);
      fVar177 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
      auVar112._16_4_ = fVar177;
      fVar176 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
      auVar112._20_4_ = fVar176;
      fVar161 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
      auVar112._24_4_ = fVar161;
      iVar2 = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
      auVar112._28_4_ = iVar2;
      auVar113._0_4_ =
           (uint)(bVar68 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar98._0_4_;
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar14 * (int)auVar88._4_4_ | (uint)!bVar14 * auVar98._4_4_;
      bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar14 * (int)auVar88._8_4_ | (uint)!bVar14 * auVar98._8_4_;
      bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar14 * (int)auVar88._12_4_ | (uint)!bVar14 * auVar98._12_4_;
      auVar113._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar98._16_4_;
      auVar113._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar98._20_4_;
      auVar113._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar98._24_4_;
      auVar113._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar98._28_4_;
      bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar69 >> 3) & 1);
      bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar99 = vsubps_avx512vl(auVar113,auVar103);
      auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar10._12_4_ |
                                              (uint)!bVar18 * auVar5._12_4_,
                                              CONCAT48((uint)bVar16 * (int)auVar10._8_4_ |
                                                       (uint)!bVar16 * auVar5._8_4_,
                                                       CONCAT44((uint)bVar14 * (int)auVar10._4_4_ |
                                                                (uint)!bVar14 * auVar5._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar10._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar5._0_4_)))),auVar102);
      auVar188 = ZEXT3264(auVar94);
      auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar164._12_4_ |
                                              (uint)!bVar19 * auVar6._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar164._8_4_ |
                                                       (uint)!bVar17 * auVar6._8_4_,
                                                       CONCAT44((uint)bVar15 * (int)auVar164._4_4_ |
                                                                (uint)!bVar15 * auVar6._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar164._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar6._0_4_)))),auVar109);
      auVar104 = vsubps_avx(auVar103,auVar110);
      auVar193 = ZEXT3264(auVar104);
      auVar98 = vsubps_avx(auVar102,auVar111);
      auVar97 = vsubps_avx(auVar109,auVar112);
      auVar41._4_4_ = auVar95._4_4_ * fVar129;
      auVar41._0_4_ = auVar95._0_4_ * fVar84;
      auVar41._8_4_ = auVar95._8_4_ * fVar131;
      auVar41._12_4_ = auVar95._12_4_ * fVar133;
      auVar41._16_4_ = auVar95._16_4_ * 0.0;
      auVar41._20_4_ = auVar95._20_4_ * 0.0;
      auVar41._24_4_ = auVar95._24_4_ * 0.0;
      auVar41._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar41,auVar109,auVar99);
      auVar171._0_4_ = fVar85 * auVar99._0_4_;
      auVar171._4_4_ = fVar130 * auVar99._4_4_;
      auVar171._8_4_ = fVar132 * auVar99._8_4_;
      auVar171._12_4_ = fVar134 * auVar99._12_4_;
      auVar171._16_4_ = auVar99._16_4_ * 0.0;
      auVar171._20_4_ = auVar99._20_4_ * 0.0;
      auVar171._24_4_ = auVar99._24_4_ * 0.0;
      auVar171._28_4_ = 0;
      auVar87 = vfmsub231ps_fma(auVar171,auVar103,auVar94);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar91,ZEXT1632(auVar86));
      auVar179._0_4_ = auVar94._0_4_ * auVar109._0_4_;
      auVar179._4_4_ = auVar94._4_4_ * auVar109._4_4_;
      auVar179._8_4_ = auVar94._8_4_ * auVar109._8_4_;
      auVar179._12_4_ = auVar94._12_4_ * auVar109._12_4_;
      auVar179._16_4_ = auVar94._16_4_ * fVar135;
      auVar179._20_4_ = auVar94._20_4_ * fVar150;
      auVar179._24_4_ = auVar94._24_4_ * fVar151;
      auVar179._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar179,auVar102,auVar95);
      auVar100 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar86));
      auVar96 = vmulps_avx512vl(auVar97,auVar110);
      auVar96 = vfmsub231ps_avx512vl(auVar96,auVar104,auVar112);
      auVar42._4_4_ = auVar98._4_4_ * auVar112._4_4_;
      auVar42._0_4_ = auVar98._0_4_ * auVar112._0_4_;
      auVar42._8_4_ = auVar98._8_4_ * auVar112._8_4_;
      auVar42._12_4_ = auVar98._12_4_ * auVar112._12_4_;
      auVar42._16_4_ = auVar98._16_4_ * fVar177;
      auVar42._20_4_ = auVar98._20_4_ * fVar176;
      auVar42._24_4_ = auVar98._24_4_ * fVar161;
      auVar42._28_4_ = iVar2;
      auVar86 = vfmsub231ps_fma(auVar42,auVar111,auVar97);
      auVar180._0_4_ = auVar111._0_4_ * auVar104._0_4_;
      auVar180._4_4_ = auVar111._4_4_ * auVar104._4_4_;
      auVar180._8_4_ = auVar111._8_4_ * auVar104._8_4_;
      auVar180._12_4_ = auVar111._12_4_ * auVar104._12_4_;
      auVar180._16_4_ = fVar175 * auVar104._16_4_;
      auVar180._20_4_ = fVar162 * auVar104._20_4_;
      auVar180._24_4_ = fVar163 * auVar104._24_4_;
      auVar180._28_4_ = 0;
      auVar87 = vfmsub231ps_fma(auVar180,auVar98,auVar110);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar91,auVar96);
      auVar92 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar86));
      auVar183 = ZEXT3264(auVar92);
      auVar96 = vmaxps_avx(auVar100,auVar92);
      uVar20 = vcmpps_avx512vl(auVar96,auVar91,2);
      bVar81 = bVar81 & (byte)uVar20;
      if (bVar81 != 0) {
        auVar43._4_4_ = auVar97._4_4_ * auVar94._4_4_;
        auVar43._0_4_ = auVar97._0_4_ * auVar94._0_4_;
        auVar43._8_4_ = auVar97._8_4_ * auVar94._8_4_;
        auVar43._12_4_ = auVar97._12_4_ * auVar94._12_4_;
        auVar43._16_4_ = auVar97._16_4_ * auVar94._16_4_;
        auVar43._20_4_ = auVar97._20_4_ * auVar94._20_4_;
        auVar43._24_4_ = auVar97._24_4_ * auVar94._24_4_;
        auVar43._28_4_ = auVar96._28_4_;
        auVar6 = vfmsub231ps_fma(auVar43,auVar98,auVar95);
        auVar44._4_4_ = auVar95._4_4_ * auVar104._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar104._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar104._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar104._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * auVar104._16_4_;
        auVar44._20_4_ = auVar95._20_4_ * auVar104._20_4_;
        auVar44._24_4_ = auVar95._24_4_ * auVar104._24_4_;
        auVar44._28_4_ = auVar95._28_4_;
        auVar5 = vfmsub231ps_fma(auVar44,auVar99,auVar97);
        auVar45._4_4_ = auVar98._4_4_ * auVar99._4_4_;
        auVar45._0_4_ = auVar98._0_4_ * auVar99._0_4_;
        auVar45._8_4_ = auVar98._8_4_ * auVar99._8_4_;
        auVar45._12_4_ = auVar98._12_4_ * auVar99._12_4_;
        auVar45._16_4_ = auVar98._16_4_ * auVar99._16_4_;
        auVar45._20_4_ = auVar98._20_4_ * auVar99._20_4_;
        auVar45._24_4_ = auVar98._24_4_ * auVar99._24_4_;
        auVar45._28_4_ = auVar98._28_4_;
        auVar7 = vfmsub231ps_fma(auVar45,auVar104,auVar94);
        auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar5),ZEXT1632(auVar7));
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
        auVar23._8_4_ = 0x3f800000;
        auVar23._0_8_ = 0x3f8000003f800000;
        auVar23._12_4_ = 0x3f800000;
        auVar23._16_4_ = 0x3f800000;
        auVar23._20_4_ = 0x3f800000;
        auVar23._24_4_ = 0x3f800000;
        auVar23._28_4_ = 0x3f800000;
        auVar94 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar87),auVar23);
        auVar86 = vfmadd132ps_fma(auVar94,auVar96,auVar96);
        auVar188 = ZEXT1664(auVar86);
        auVar46._4_4_ = auVar7._4_4_ * auVar109._4_4_;
        auVar46._0_4_ = auVar7._0_4_ * auVar109._0_4_;
        auVar46._8_4_ = auVar7._8_4_ * auVar109._8_4_;
        auVar46._12_4_ = auVar7._12_4_ * auVar109._12_4_;
        auVar46._16_4_ = fVar135 * 0.0;
        auVar46._20_4_ = fVar150 * 0.0;
        auVar46._24_4_ = fVar151 * 0.0;
        auVar46._28_4_ = iVar1;
        auVar5 = vfmadd231ps_fma(auVar46,auVar102,ZEXT1632(auVar5));
        auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar103,ZEXT1632(auVar6));
        fVar135 = auVar86._0_4_;
        fVar150 = auVar86._4_4_;
        fVar151 = auVar86._8_4_;
        fVar163 = auVar86._12_4_;
        local_280._28_4_ = auVar96._28_4_;
        local_280._0_28_ =
             ZEXT1628(CONCAT412(auVar5._12_4_ * fVar163,
                                CONCAT48(auVar5._8_4_ * fVar151,
                                         CONCAT44(auVar5._4_4_ * fVar150,auVar5._0_4_ * fVar135))));
        auVar193 = ZEXT3264(local_280);
        auVar142._4_4_ = local_480;
        auVar142._0_4_ = local_480;
        auVar142._8_4_ = local_480;
        auVar142._12_4_ = local_480;
        auVar142._16_4_ = local_480;
        auVar142._20_4_ = local_480;
        auVar142._24_4_ = local_480;
        auVar142._28_4_ = local_480;
        uVar20 = vcmpps_avx512vl(auVar142,local_280,2);
        uVar152 = *(undefined4 *)(ray + sVar80 * 4 + 0x80);
        auVar24._4_4_ = uVar152;
        auVar24._0_4_ = uVar152;
        auVar24._8_4_ = uVar152;
        auVar24._12_4_ = uVar152;
        auVar24._16_4_ = uVar152;
        auVar24._20_4_ = uVar152;
        auVar24._24_4_ = uVar152;
        auVar24._28_4_ = uVar152;
        uVar21 = vcmpps_avx512vl(local_280,auVar24,2);
        bVar81 = (byte)uVar20 & (byte)uVar21 & bVar81;
        if (bVar81 != 0) {
          uVar82 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar82 = bVar81 & uVar82;
          if ((char)uVar82 != '\0') {
            fVar162 = auVar100._0_4_ * fVar135;
            fVar175 = auVar100._4_4_ * fVar150;
            auVar47._4_4_ = fVar175;
            auVar47._0_4_ = fVar162;
            fVar176 = auVar100._8_4_ * fVar151;
            auVar47._8_4_ = fVar176;
            fVar161 = auVar100._12_4_ * fVar163;
            auVar47._12_4_ = fVar161;
            fVar177 = auVar100._16_4_ * 0.0;
            auVar47._16_4_ = fVar177;
            fVar84 = auVar100._20_4_ * 0.0;
            auVar47._20_4_ = fVar84;
            fVar85 = auVar100._24_4_ * 0.0;
            auVar47._24_4_ = fVar85;
            auVar47._28_4_ = auVar100._28_4_;
            auVar143._8_4_ = 0x3f800000;
            auVar143._0_8_ = 0x3f8000003f800000;
            auVar143._12_4_ = 0x3f800000;
            auVar143._16_4_ = 0x3f800000;
            auVar143._20_4_ = 0x3f800000;
            auVar143._24_4_ = 0x3f800000;
            auVar143._28_4_ = 0x3f800000;
            auVar96 = vsubps_avx(auVar143,auVar47);
            local_2c0._0_4_ =
                 (float)((uint)(bVar68 & 1) * (int)fVar162 |
                        (uint)!(bool)(bVar68 & 1) * auVar96._0_4_);
            bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar14 * (int)fVar175 | (uint)!bVar14 * auVar96._4_4_);
            bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar14 * (int)fVar176 | (uint)!bVar14 * auVar96._8_4_);
            bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar14 * (int)fVar161 | (uint)!bVar14 * auVar96._12_4_)
            ;
            bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar14 * (int)fVar177 | (uint)!bVar14 * auVar96._16_4_)
            ;
            bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar14 * (int)fVar84 | (uint)!bVar14 * auVar96._20_4_);
            bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar14 * (int)fVar85 | (uint)!bVar14 * auVar96._24_4_);
            bVar14 = SUB81(uVar69 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar96._28_4_);
            auVar96 = vsubps_avx(auVar90,auVar93);
            auVar86 = vfmadd213ps_fma(auVar96,local_2c0,auVar93);
            uVar152 = *(undefined4 *)((long)local_558->ray_space + sVar80 * 4 + -0x10);
            auVar25._4_4_ = uVar152;
            auVar25._0_4_ = uVar152;
            auVar25._8_4_ = uVar152;
            auVar25._12_4_ = uVar152;
            auVar25._16_4_ = uVar152;
            auVar25._20_4_ = uVar152;
            auVar25._24_4_ = uVar152;
            auVar25._28_4_ = uVar152;
            auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                         CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                  CONCAT44(auVar86._4_4_ +
                                                                           auVar86._4_4_,
                                                                           auVar86._0_4_ +
                                                                           auVar86._0_4_)))),auVar25
                                     );
            uVar83 = vcmpps_avx512vl(local_280,auVar96,6);
            uVar82 = uVar82 & uVar83;
            bVar81 = (byte)uVar82;
            if (bVar81 != 0) {
              auVar159._0_4_ = auVar92._0_4_ * fVar135;
              auVar159._4_4_ = auVar92._4_4_ * fVar150;
              auVar159._8_4_ = auVar92._8_4_ * fVar151;
              auVar159._12_4_ = auVar92._12_4_ * fVar163;
              auVar159._16_4_ = auVar92._16_4_ * 0.0;
              auVar159._20_4_ = auVar92._20_4_ * 0.0;
              auVar159._24_4_ = auVar92._24_4_ * 0.0;
              auVar159._28_4_ = 0;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = 0x3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar96 = vsubps_avx(auVar172,auVar159);
              auVar114._0_4_ =
                   (uint)(bVar68 & 1) * (int)auVar159._0_4_ |
                   (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
              bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
              auVar114._4_4_ = (uint)bVar14 * (int)auVar159._4_4_ | (uint)!bVar14 * auVar96._4_4_;
              bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
              auVar114._8_4_ = (uint)bVar14 * (int)auVar159._8_4_ | (uint)!bVar14 * auVar96._8_4_;
              bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
              auVar114._12_4_ = (uint)bVar14 * (int)auVar159._12_4_ | (uint)!bVar14 * auVar96._12_4_
              ;
              bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
              auVar114._16_4_ = (uint)bVar14 * (int)auVar159._16_4_ | (uint)!bVar14 * auVar96._16_4_
              ;
              bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
              auVar114._20_4_ = (uint)bVar14 * (int)auVar159._20_4_ | (uint)!bVar14 * auVar96._20_4_
              ;
              bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
              auVar114._24_4_ = (uint)bVar14 * (int)auVar159._24_4_ | (uint)!bVar14 * auVar96._24_4_
              ;
              auVar114._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar114,auVar172,auVar26);
              local_260 = 0;
              local_25c = iVar77;
              local_250 = local_5b0._0_8_;
              uStack_248 = local_5b0._8_8_;
              local_240 = local_5d0._0_8_;
              uStack_238 = local_5d0._8_8_;
              local_230 = local_5e0._0_8_;
              uStack_228 = local_5e0._8_8_;
              local_220 = local_5c0;
              uStack_218 = uStack_5b8;
              if ((pGVar75->mask & *(uint *)(ray + sVar80 * 4 + 0x90)) != 0) {
                fVar154 = 1.0 / auVar200._0_4_;
                local_200[0] = fVar154 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar154 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar154 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar154 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar154 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar154 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar154 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_280;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar96 = vblendmps_avx512vl(auVar144,local_280);
                auVar115._0_4_ =
                     (uint)(bVar81 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
                auVar115._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
                auVar115._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
                auVar115._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                auVar115._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * 0x7f800000;
                bVar14 = SUB81(uVar82 >> 7,0);
                auVar115._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * 0x7f800000;
                auVar96 = vshufps_avx(auVar115,auVar115,0xb1);
                auVar96 = vminps_avx(auVar115,auVar96);
                auVar94 = vshufpd_avx(auVar96,auVar96,5);
                auVar96 = vminps_avx(auVar96,auVar94);
                auVar94 = vpermpd_avx2(auVar96,0x4e);
                auVar96 = vminps_avx(auVar96,auVar94);
                uVar20 = vcmpps_avx512vl(auVar115,auVar96,0);
                uVar70 = (uint)uVar82;
                if ((bVar81 & (byte)uVar20) != 0) {
                  uVar70 = (uint)(bVar81 & (byte)uVar20);
                }
                uVar22 = 0;
                for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                  uVar22 = uVar22 + 1;
                }
                uVar69 = (ulong)uVar22;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_4a0 = *(float *)(ray + sVar80 * 4 + 0x80);
                  fStack_49c = 0.0;
                  fStack_498 = 0.0;
                  fStack_494 = 0.0;
                  local_540 = local_280;
                  do {
                    local_420 = local_200[uVar69];
                    local_410 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x80) =
                         *(undefined4 *)(local_1c0 + uVar69 * 4);
                    local_5a0.context = context->user;
                    fVar135 = 1.0 - local_420;
                    fVar154 = fVar135 * fVar135 * -3.0;
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                              ZEXT416((uint)(local_420 * fVar135)),
                                              ZEXT416(0xc0000000));
                    auVar87 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar135)),
                                              ZEXT416((uint)(local_420 * local_420)),
                                              ZEXT416(0x40000000));
                    fVar135 = auVar86._0_4_ * 3.0;
                    fVar150 = auVar87._0_4_ * 3.0;
                    fVar151 = local_420 * local_420 * 3.0;
                    auVar187._0_4_ = fVar151 * (float)local_5c0._0_4_;
                    auVar187._4_4_ = fVar151 * (float)local_5c0._4_4_;
                    auVar187._8_4_ = fVar151 * (float)uStack_5b8;
                    auVar187._12_4_ = fVar151 * uStack_5b8._4_4_;
                    auVar188 = ZEXT1664(auVar187);
                    auVar139._4_4_ = fVar150;
                    auVar139._0_4_ = fVar150;
                    auVar139._8_4_ = fVar150;
                    auVar139._12_4_ = fVar150;
                    auVar86 = vfmadd132ps_fma(auVar139,auVar187,local_5e0);
                    auVar169._4_4_ = fVar135;
                    auVar169._0_4_ = fVar135;
                    auVar169._8_4_ = fVar135;
                    auVar169._12_4_ = fVar135;
                    auVar86 = vfmadd132ps_fma(auVar169,auVar86,local_5d0);
                    auVar140._4_4_ = fVar154;
                    auVar140._0_4_ = fVar154;
                    auVar140._8_4_ = fVar154;
                    auVar140._12_4_ = fVar154;
                    auVar86 = vfmadd132ps_fma(auVar140,auVar86,local_5b0);
                    local_450 = auVar86._0_4_;
                    local_440 = vshufps_avx(auVar86,auVar86,0x55);
                    auVar183 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar86,auVar86,0xaa);
                    iStack_44c = local_450;
                    iStack_448 = local_450;
                    iStack_444 = local_450;
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_4e0._0_8_;
                    uStack_3f8 = local_4e0._8_8_;
                    local_3f0 = local_4d0;
                    vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                    uStack_3dc = (local_5a0.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_5a0.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_610 = local_4f0;
                    local_5a0.valid = (int *)local_610;
                    local_5a0.geometryUserPtr = pGVar75->userPtr;
                    local_5a0.hit = (RTCHitN *)&local_450;
                    local_5a0.N = 4;
                    local_5a0.ray = (RTCRayN *)ray;
                    if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar183 = ZEXT1664(local_440);
                      auVar188 = ZEXT1664(auVar187);
                      (*pGVar75->intersectionFilterN)(&local_5a0);
                      auVar193 = ZEXT3264(local_540);
                      auVar212 = ZEXT3264(local_4c0);
                      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar211 = ZEXT1664(auVar86);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar209 = ZEXT3264(auVar96);
                      sVar80 = local_560;
                    }
                    uVar83 = vptestmd_avx512vl(local_610,local_610);
                    if ((uVar83 & 0xf) == 0) {
LAB_01a1e729:
                      *(float *)(ray + sVar80 * 4 + 0x80) = local_4a0;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar183 = ZEXT1664(auVar183._0_16_);
                        auVar188 = ZEXT1664(auVar188._0_16_);
                        (*p_Var13)(&local_5a0);
                        auVar193 = ZEXT3264(local_540);
                        auVar212 = ZEXT3264(local_4c0);
                        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar211 = ZEXT1664(auVar86);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar209 = ZEXT3264(auVar96);
                        sVar80 = local_560;
                      }
                      uVar83 = vptestmd_avx512vl(local_610,local_610);
                      uVar83 = uVar83 & 0xf;
                      bVar81 = (byte)uVar83;
                      if (bVar81 == 0) goto LAB_01a1e729;
                      iVar1 = *(int *)(local_5a0.hit + 4);
                      iVar2 = *(int *)(local_5a0.hit + 8);
                      iVar65 = *(int *)(local_5a0.hit + 0xc);
                      bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar16 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xc0) =
                           (uint)(bVar81 & 1) * *(int *)local_5a0.hit |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xc0);
                      *(uint *)(local_5a0.ray + 0xc4) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xc4);
                      *(uint *)(local_5a0.ray + 200) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_5a0.ray + 200);
                      *(uint *)(local_5a0.ray + 0xcc) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xcc);
                      iVar1 = *(int *)(local_5a0.hit + 0x14);
                      iVar2 = *(int *)(local_5a0.hit + 0x18);
                      iVar65 = *(int *)(local_5a0.hit + 0x1c);
                      bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar16 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xd0) =
                           (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x10) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xd0);
                      *(uint *)(local_5a0.ray + 0xd4) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xd4);
                      *(uint *)(local_5a0.ray + 0xd8) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0xd8);
                      *(uint *)(local_5a0.ray + 0xdc) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xdc);
                      iVar1 = *(int *)(local_5a0.hit + 0x24);
                      iVar2 = *(int *)(local_5a0.hit + 0x28);
                      iVar65 = *(int *)(local_5a0.hit + 0x2c);
                      bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar16 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xe0) =
                           (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x20) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xe0);
                      *(uint *)(local_5a0.ray + 0xe4) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xe4);
                      *(uint *)(local_5a0.ray + 0xe8) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0xe8);
                      *(uint *)(local_5a0.ray + 0xec) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xec);
                      iVar1 = *(int *)(local_5a0.hit + 0x34);
                      iVar2 = *(int *)(local_5a0.hit + 0x38);
                      iVar65 = *(int *)(local_5a0.hit + 0x3c);
                      bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar16 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xf0) =
                           (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x30) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xf0);
                      *(uint *)(local_5a0.ray + 0xf4) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xf4);
                      *(uint *)(local_5a0.ray + 0xf8) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0xf8);
                      *(uint *)(local_5a0.ray + 0xfc) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xfc);
                      iVar1 = *(int *)(local_5a0.hit + 0x44);
                      iVar2 = *(int *)(local_5a0.hit + 0x48);
                      iVar65 = *(int *)(local_5a0.hit + 0x4c);
                      bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar16 = SUB81(uVar83 >> 3,0);
                      *(uint *)(local_5a0.ray + 0x100) =
                           (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x40) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0x100);
                      *(uint *)(local_5a0.ray + 0x104) =
                           (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0x104);
                      *(uint *)(local_5a0.ray + 0x108) =
                           (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0x108);
                      *(uint *)(local_5a0.ray + 0x10c) =
                           (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0x10c);
                      auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar86;
                      auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar86;
                      auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar86;
                      auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar86;
                      local_4a0 = *(float *)(ray + sVar80 * 4 + 0x80);
                      fStack_49c = 0.0;
                      fStack_498 = 0.0;
                      fStack_494 = 0.0;
                    }
                    bVar81 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar82;
                    auVar148._4_4_ = local_4a0;
                    auVar148._0_4_ = local_4a0;
                    auVar148._8_4_ = local_4a0;
                    auVar148._12_4_ = local_4a0;
                    auVar148._16_4_ = local_4a0;
                    auVar148._20_4_ = local_4a0;
                    auVar148._24_4_ = local_4a0;
                    auVar148._28_4_ = local_4a0;
                    uVar20 = vcmpps_avx512vl(auVar193._0_32_,auVar148,2);
                    if ((bVar81 & (byte)uVar20) == 0) goto LAB_01a1d6ea;
                    bVar81 = bVar81 & (byte)uVar20;
                    uVar82 = (ulong)bVar81;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar96 = vblendmps_avx512vl(auVar149,auVar193._0_32_);
                    auVar128._0_4_ =
                         (uint)(bVar81 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000
                    ;
                    bVar14 = (bool)(bVar81 >> 1 & 1);
                    auVar128._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar81 >> 2 & 1);
                    auVar128._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar81 >> 3 & 1);
                    auVar128._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar81 >> 4 & 1);
                    auVar128._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar81 >> 5 & 1);
                    auVar128._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar81 >> 6 & 1);
                    auVar128._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar128._28_4_ =
                         (uint)(bVar81 >> 7) * auVar96._28_4_ |
                         (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                    auVar96 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar96 = vminps_avx(auVar128,auVar96);
                    auVar94 = vshufpd_avx(auVar96,auVar96,5);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    auVar94 = vpermpd_avx2(auVar96,0x4e);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    uVar20 = vcmpps_avx512vl(auVar128,auVar96,0);
                    bVar68 = (byte)uVar20 & bVar81;
                    if (bVar68 != 0) {
                      bVar81 = bVar68;
                    }
                    uVar71 = 0;
                    for (uVar72 = (uint)bVar81; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000
                        ) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar69 = (ulong)uVar71;
                  } while( true );
                }
                fVar154 = local_200[uVar69];
                uVar152 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                fVar150 = 1.0 - fVar154;
                fVar135 = fVar150 * fVar150 * -3.0;
                auVar183 = ZEXT464((uint)fVar135);
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),
                                          ZEXT416((uint)(fVar154 * fVar150)),ZEXT416(0xc0000000));
                auVar87 = vfmsub132ss_fma(ZEXT416((uint)(fVar154 * fVar150)),
                                          ZEXT416((uint)(fVar154 * fVar154)),ZEXT416(0x40000000));
                fVar150 = auVar86._0_4_ * 3.0;
                fVar151 = auVar87._0_4_ * 3.0;
                fVar163 = fVar154 * fVar154 * 3.0;
                auVar184._0_4_ = fVar163 * (float)local_5c0._0_4_;
                auVar184._4_4_ = fVar163 * (float)local_5c0._4_4_;
                auVar184._8_4_ = fVar163 * (float)uStack_5b8;
                auVar184._12_4_ = fVar163 * uStack_5b8._4_4_;
                auVar188 = ZEXT1664(auVar184);
                auVar155._4_4_ = fVar151;
                auVar155._0_4_ = fVar151;
                auVar155._8_4_ = fVar151;
                auVar155._12_4_ = fVar151;
                auVar86 = vfmadd132ps_fma(auVar155,auVar184,local_5e0);
                auVar166._4_4_ = fVar150;
                auVar166._0_4_ = fVar150;
                auVar166._8_4_ = fVar150;
                auVar166._12_4_ = fVar150;
                auVar86 = vfmadd132ps_fma(auVar166,auVar86,local_5d0);
                auVar156._4_4_ = fVar135;
                auVar156._0_4_ = fVar135;
                auVar156._8_4_ = fVar135;
                auVar156._12_4_ = fVar135;
                auVar86 = vfmadd132ps_fma(auVar156,auVar86,local_5b0);
                *(undefined4 *)(ray + sVar80 * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar69 * 4);
                *(int *)(ray + sVar80 * 4 + 0xc0) = auVar86._0_4_;
                uVar12 = vextractps_avx(auVar86,1);
                *(undefined4 *)(ray + sVar80 * 4 + 0xd0) = uVar12;
                uVar12 = vextractps_avx(auVar86,2);
                *(undefined4 *)(ray + sVar80 * 4 + 0xe0) = uVar12;
                *(float *)(ray + sVar80 * 4 + 0xf0) = fVar154;
                *(undefined4 *)(ray + sVar80 * 4 + 0x100) = uVar152;
                *(uint *)(ray + sVar80 * 4 + 0x110) = uVar72;
                *(uint *)(ray + sVar80 * 4 + 0x120) = uVar71;
                *(uint *)(ray + sVar80 * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + sVar80 * 4 + 0x140) = context->user->instPrimID[0];
LAB_01a1d6ea:
                prim = local_5f8;
                fVar154 = (float)local_570._0_4_;
              }
            }
          }
        }
      }
    }
    local_570._0_4_ = fVar154;
    if (8 < iVar77) {
      auVar96 = vpbroadcastd_avx512vl();
      auVar210 = ZEXT3264(auVar96);
      local_4a0 = (float)local_570._0_4_;
      fStack_49c = (float)local_570._0_4_;
      fStack_498 = (float)local_570._0_4_;
      fStack_494 = (float)local_570._0_4_;
      fStack_490 = (float)local_570._0_4_;
      fStack_48c = (float)local_570._0_4_;
      fStack_488 = (float)local_570._0_4_;
      fStack_484 = (float)local_570._0_4_;
      uStack_47c = local_480;
      uStack_478 = local_480;
      uStack_474 = local_480;
      uStack_470 = local_480;
      uStack_46c = local_480;
      uStack_468 = local_480;
      uStack_464 = local_480;
      local_120 = 1.0 / (float)local_520._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar76 = 8;
LAB_01a1d775:
      if (lVar76 < local_548) {
        auVar96 = vpbroadcastd_avx512vl();
        auVar96 = vpor_avx2(auVar96,_DAT_01fb4ba0);
        uVar21 = vpcmpgtd_avx512vl(auVar210._0_32_,auVar96);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 * 4 + lVar79);
        auVar94 = *(undefined1 (*) [32])(lVar79 + 0x21fb768 + lVar76 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar79 + 0x21fbbec + lVar76 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar79 + 0x21fc070 + lVar76 * 4);
        auVar189._0_4_ = auVar104._0_4_ * (float)local_3a0._0_4_;
        auVar189._4_4_ = auVar104._4_4_ * (float)local_3a0._4_4_;
        auVar189._8_4_ = auVar104._8_4_ * fStack_398;
        auVar189._12_4_ = auVar104._12_4_ * fStack_394;
        auVar189._16_4_ = auVar104._16_4_ * fStack_390;
        auVar189._20_4_ = auVar104._20_4_ * fStack_38c;
        auVar189._28_36_ = auVar188._28_36_;
        auVar189._24_4_ = auVar104._24_4_ * fStack_388;
        auVar188._0_4_ = auVar104._0_4_ * (float)local_3c0._0_4_;
        auVar188._4_4_ = auVar104._4_4_ * (float)local_3c0._4_4_;
        auVar188._8_4_ = auVar104._8_4_ * fStack_3b8;
        auVar188._12_4_ = auVar104._12_4_ * fStack_3b4;
        auVar188._16_4_ = auVar104._16_4_ * fStack_3b0;
        auVar188._20_4_ = auVar104._20_4_ * fStack_3ac;
        auVar188._28_36_ = auVar183._28_36_;
        auVar188._24_4_ = auVar104._24_4_ * fStack_3a8;
        auVar98 = vmulps_avx512vl(local_e0,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar95,local_360);
        auVar103 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar95,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_320);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_340);
        auVar102 = vfmadd231ps_avx512vl(auVar98,auVar94,local_a0);
        auVar86 = vfmadd231ps_fma(auVar97,auVar96,local_2e0);
        auVar188 = ZEXT1664(auVar86);
        auVar87 = vfmadd231ps_fma(auVar103,auVar96,local_300);
        auVar183 = ZEXT1664(auVar87);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 * 4 + lVar79);
        auVar97 = *(undefined1 (*) [32])(lVar79 + 0x21fdb88 + lVar76 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar102,auVar96,local_100);
        auVar103 = *(undefined1 (*) [32])(lVar79 + 0x21fe00c + lVar76 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar79 + 0x21fe490 + lVar76 * 4);
        auVar194._0_4_ = auVar102._0_4_ * (float)local_3a0._0_4_;
        auVar194._4_4_ = auVar102._4_4_ * (float)local_3a0._4_4_;
        auVar194._8_4_ = auVar102._8_4_ * fStack_398;
        auVar194._12_4_ = auVar102._12_4_ * fStack_394;
        auVar194._16_4_ = auVar102._16_4_ * fStack_390;
        auVar194._20_4_ = auVar102._20_4_ * fStack_38c;
        auVar194._28_36_ = auVar193._28_36_;
        auVar194._24_4_ = auVar102._24_4_ * fStack_388;
        auVar48._4_4_ = auVar102._4_4_ * (float)local_3c0._4_4_;
        auVar48._0_4_ = auVar102._0_4_ * (float)local_3c0._0_4_;
        auVar48._8_4_ = auVar102._8_4_ * fStack_3b8;
        auVar48._12_4_ = auVar102._12_4_ * fStack_3b4;
        auVar48._16_4_ = auVar102._16_4_ * fStack_3b0;
        auVar48._20_4_ = auVar102._20_4_ * fStack_3ac;
        auVar48._24_4_ = auVar102._24_4_ * fStack_3a8;
        auVar48._28_4_ = uStack_3a4;
        auVar99 = vmulps_avx512vl(local_e0,auVar102);
        auVar100 = vfmadd231ps_avx512vl(auVar194._0_32_,auVar103,local_360);
        auVar93 = vfmadd231ps_avx512vl(auVar48,auVar103,local_380);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_320);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_a0);
        auVar5 = vfmadd231ps_fma(auVar100,auVar98,local_2e0);
        auVar193 = ZEXT1664(auVar5);
        auVar6 = vfmadd231ps_fma(auVar93,auVar98,local_300);
        auVar93 = vfmadd231ps_avx512vl(auVar99,auVar98,local_100);
        auVar90 = vmaxps_avx512vl(auVar92,auVar93);
        auVar99 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar86));
        auVar100 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar87));
        auVar91 = vmulps_avx512vl(ZEXT1632(auVar87),auVar99);
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar86),auVar100);
        auVar91 = vsubps_avx512vl(auVar91,auVar101);
        auVar101 = vmulps_avx512vl(auVar100,auVar100);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
        auVar90 = vmulps_avx512vl(auVar90,auVar90);
        auVar90 = vmulps_avx512vl(auVar90,auVar101);
        auVar91 = vmulps_avx512vl(auVar91,auVar91);
        uVar20 = vcmpps_avx512vl(auVar91,auVar90,2);
        bVar81 = (byte)uVar21 & (byte)uVar20;
        if (bVar81 != 0) {
          in_ZMM25 = ZEXT3264(local_1a0);
          auVar102 = vmulps_avx512vl(local_1a0,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar102);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar103);
          local_4c0 = auVar212._0_32_;
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_4c0,auVar97);
          auVar104 = vmulps_avx512vl(local_1a0,auVar104);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_180,auVar104);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_160,auVar95);
          auVar97 = vfmadd213ps_avx512vl(auVar96,local_4c0,auVar94);
          auVar96 = *(undefined1 (*) [32])(lVar79 + 0x21fc4f4 + lVar76 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar79 + 0x21fc978 + lVar76 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar79 + 0x21fcdfc + lVar76 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar79 + 0x21fd280 + lVar76 * 4);
          auVar103 = vmulps_avx512vl(_local_3a0,auVar104);
          auVar102 = vmulps_avx512vl(_local_3c0,auVar104);
          auVar104 = vmulps_avx512vl(local_1a0,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_360);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar95,local_380);
          auVar95 = vfmadd231ps_avx512vl(auVar104,local_180,auVar95);
          auVar104 = vfmadd231ps_avx512vl(auVar103,auVar94,local_320);
          auVar103 = vfmadd231ps_avx512vl(auVar102,auVar94,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_2e0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_300);
          auVar102 = vfmadd231ps_avx512vl(auVar94,local_4c0,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar79 + 0x21fe914 + lVar76 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar79 + 0x21ff21c + lVar76 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar79 + 0x21ff6a0 + lVar76 * 4);
          auVar90 = vmulps_avx512vl(_local_3a0,auVar95);
          auVar91 = vmulps_avx512vl(_local_3c0,auVar95);
          auVar95 = vmulps_avx512vl(local_1a0,auVar95);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_360);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar94,local_380);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_180,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar79 + 0x21fed98 + lVar76 * 4);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_320);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar94,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
          auVar95 = vfmadd231ps_avx512vl(auVar90,auVar96,local_2e0);
          auVar90 = vfmadd231ps_avx512vl(auVar91,auVar96,local_300);
          auVar94 = vfmadd231ps_avx512vl(auVar94,local_4c0,auVar96);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar104,auVar91);
          vandps_avx512vl(auVar103,auVar91);
          auVar96 = vmaxps_avx(auVar91,auVar91);
          vandps_avx512vl(auVar102,auVar91);
          auVar96 = vmaxps_avx(auVar96,auVar91);
          auVar66._4_4_ = fStack_49c;
          auVar66._0_4_ = local_4a0;
          auVar66._8_4_ = fStack_498;
          auVar66._12_4_ = fStack_494;
          auVar66._16_4_ = fStack_490;
          auVar66._20_4_ = fStack_48c;
          auVar66._24_4_ = fStack_488;
          auVar66._28_4_ = fStack_484;
          uVar69 = vcmpps_avx512vl(auVar96,auVar66,1);
          bVar14 = (bool)((byte)uVar69 & 1);
          auVar116._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar104._0_4_);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar104._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar104._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar104._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar104._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar104._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar104._24_4_)
          ;
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar116._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar104._28_4_;
          bVar14 = (bool)((byte)uVar69 & 1);
          auVar117._0_4_ = (float)((uint)bVar14 * auVar100._0_4_ | (uint)!bVar14 * auVar103._0_4_);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar103._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar103._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar117._12_4_ =
               (float)((uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar103._12_4_);
          bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar117._16_4_ =
               (float)((uint)bVar14 * auVar100._16_4_ | (uint)!bVar14 * auVar103._16_4_);
          bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar117._20_4_ =
               (float)((uint)bVar14 * auVar100._20_4_ | (uint)!bVar14 * auVar103._20_4_);
          bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar117._24_4_ =
               (float)((uint)bVar14 * auVar100._24_4_ | (uint)!bVar14 * auVar103._24_4_);
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar117._28_4_ = (uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar103._28_4_;
          vandps_avx512vl(auVar95,auVar91);
          vandps_avx512vl(auVar90,auVar91);
          auVar96 = vmaxps_avx(auVar117,auVar117);
          vandps_avx512vl(auVar94,auVar91);
          auVar96 = vmaxps_avx(auVar96,auVar117);
          uVar69 = vcmpps_avx512vl(auVar96,auVar66,1);
          bVar14 = (bool)((byte)uVar69 & 1);
          auVar118._0_4_ = (uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar95._0_4_;
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar95._4_4_;
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar95._8_4_;
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar95._12_4_;
          bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar118._16_4_ = (uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar95._16_4_;
          bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar118._20_4_ = (uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar95._20_4_;
          bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar118._24_4_ = (uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar95._24_4_;
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar118._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar95._28_4_;
          bVar14 = (bool)((byte)uVar69 & 1);
          auVar119._0_4_ = (float)((uint)bVar14 * auVar100._0_4_ | (uint)!bVar14 * auVar90._0_4_);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar14 * auVar100._4_4_ | (uint)!bVar14 * auVar90._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar14 * auVar100._8_4_ | (uint)!bVar14 * auVar90._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar14 * auVar100._12_4_ | (uint)!bVar14 * auVar90._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar14 * auVar100._16_4_ | (uint)!bVar14 * auVar90._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar14 * auVar100._20_4_ | (uint)!bVar14 * auVar90._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar14 * auVar100._24_4_ | (uint)!bVar14 * auVar90._24_4_)
          ;
          bVar14 = SUB81(uVar69 >> 7,0);
          auVar119._28_4_ = (uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar90._28_4_;
          auVar197._8_4_ = 0x80000000;
          auVar197._0_8_ = 0x8000000080000000;
          auVar197._12_4_ = 0x80000000;
          auVar197._16_4_ = 0x80000000;
          auVar197._20_4_ = 0x80000000;
          auVar197._24_4_ = 0x80000000;
          auVar197._28_4_ = 0x80000000;
          auVar96 = vxorps_avx512vl(auVar118,auVar197);
          auVar89 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
          auVar94 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar89));
          auVar7 = vfmadd231ps_fma(auVar94,auVar117,auVar117);
          auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar208._8_4_ = 0xbf000000;
          auVar208._0_8_ = 0xbf000000bf000000;
          auVar208._12_4_ = 0xbf000000;
          auVar208._16_4_ = 0xbf000000;
          auVar208._20_4_ = 0xbf000000;
          auVar208._24_4_ = 0xbf000000;
          auVar208._28_4_ = 0xbf000000;
          fVar154 = auVar94._0_4_;
          fVar135 = auVar94._4_4_;
          fVar150 = auVar94._8_4_;
          fVar151 = auVar94._12_4_;
          fVar163 = auVar94._16_4_;
          fVar162 = auVar94._20_4_;
          fVar175 = auVar94._24_4_;
          auVar49._4_4_ = fVar135 * fVar135 * fVar135 * auVar7._4_4_ * -0.5;
          auVar49._0_4_ = fVar154 * fVar154 * fVar154 * auVar7._0_4_ * -0.5;
          auVar49._8_4_ = fVar150 * fVar150 * fVar150 * auVar7._8_4_ * -0.5;
          auVar49._12_4_ = fVar151 * fVar151 * fVar151 * auVar7._12_4_ * -0.5;
          auVar49._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
          auVar49._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar49._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar49._28_4_ = auVar117._28_4_;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar94 = vfmadd231ps_avx512vl(auVar49,auVar95,auVar94);
          auVar50._4_4_ = auVar117._4_4_ * auVar94._4_4_;
          auVar50._0_4_ = auVar117._0_4_ * auVar94._0_4_;
          auVar50._8_4_ = auVar117._8_4_ * auVar94._8_4_;
          auVar50._12_4_ = auVar117._12_4_ * auVar94._12_4_;
          auVar50._16_4_ = auVar117._16_4_ * auVar94._16_4_;
          auVar50._20_4_ = auVar117._20_4_ * auVar94._20_4_;
          auVar50._24_4_ = auVar117._24_4_ * auVar94._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar94._4_4_ * -auVar116._4_4_;
          auVar51._0_4_ = auVar94._0_4_ * -auVar116._0_4_;
          auVar51._8_4_ = auVar94._8_4_ * -auVar116._8_4_;
          auVar51._12_4_ = auVar94._12_4_ * -auVar116._12_4_;
          auVar51._16_4_ = auVar94._16_4_ * -auVar116._16_4_;
          auVar51._20_4_ = auVar94._20_4_ * -auVar116._20_4_;
          auVar51._24_4_ = auVar94._24_4_ * -auVar116._24_4_;
          auVar51._28_4_ = auVar117._28_4_;
          auVar104 = vmulps_avx512vl(auVar94,ZEXT1632(auVar89));
          auVar102 = ZEXT1632(auVar89);
          auVar94 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar102);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar119,auVar119);
          auVar103 = vrsqrt14ps_avx512vl(auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar208);
          fVar154 = auVar103._0_4_;
          fVar135 = auVar103._4_4_;
          fVar150 = auVar103._8_4_;
          fVar151 = auVar103._12_4_;
          fVar163 = auVar103._16_4_;
          fVar162 = auVar103._20_4_;
          fVar175 = auVar103._24_4_;
          auVar52._4_4_ = fVar135 * fVar135 * fVar135 * auVar94._4_4_;
          auVar52._0_4_ = fVar154 * fVar154 * fVar154 * auVar94._0_4_;
          auVar52._8_4_ = fVar150 * fVar150 * fVar150 * auVar94._8_4_;
          auVar52._12_4_ = fVar151 * fVar151 * fVar151 * auVar94._12_4_;
          auVar52._16_4_ = fVar163 * fVar163 * fVar163 * auVar94._16_4_;
          auVar52._20_4_ = fVar162 * fVar162 * fVar162 * auVar94._20_4_;
          auVar52._24_4_ = fVar175 * fVar175 * fVar175 * auVar94._24_4_;
          auVar52._28_4_ = auVar94._28_4_;
          auVar94 = vfmadd231ps_avx512vl(auVar52,auVar95,auVar103);
          auVar53._4_4_ = auVar119._4_4_ * auVar94._4_4_;
          auVar53._0_4_ = auVar119._0_4_ * auVar94._0_4_;
          auVar53._8_4_ = auVar119._8_4_ * auVar94._8_4_;
          auVar53._12_4_ = auVar119._12_4_ * auVar94._12_4_;
          auVar53._16_4_ = auVar119._16_4_ * auVar94._16_4_;
          auVar53._20_4_ = auVar119._20_4_ * auVar94._20_4_;
          auVar53._24_4_ = auVar119._24_4_ * auVar94._24_4_;
          auVar53._28_4_ = auVar103._28_4_;
          auVar54._4_4_ = auVar94._4_4_ * auVar96._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar96._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar96._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar96._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * auVar96._16_4_;
          auVar54._20_4_ = auVar94._20_4_ * auVar96._20_4_;
          auVar54._24_4_ = auVar94._24_4_ * auVar96._24_4_;
          auVar54._28_4_ = auVar96._28_4_;
          auVar96 = vmulps_avx512vl(auVar94,auVar102);
          auVar7 = vfmadd213ps_fma(auVar50,auVar92,ZEXT1632(auVar86));
          auVar8 = vfmadd213ps_fma(auVar51,auVar92,ZEXT1632(auVar87));
          auVar95 = vfmadd213ps_avx512vl(auVar104,auVar92,auVar97);
          auVar103 = vfmadd213ps_avx512vl(auVar53,auVar93,ZEXT1632(auVar5));
          auVar10 = vfnmadd213ps_fma(auVar50,auVar92,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar54,auVar93,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar51,auVar92,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar96,auVar93,auVar98);
          auVar164 = vfnmadd231ps_fma(auVar97,auVar92,auVar104);
          auVar136 = vfnmadd213ps_fma(auVar53,auVar93,ZEXT1632(auVar5));
          auVar88 = vfnmadd213ps_fma(auVar54,auVar93,ZEXT1632(auVar6));
          auVar165 = vfnmadd231ps_fma(auVar98,auVar93,auVar96);
          auVar98 = vsubps_avx512vl(auVar103,ZEXT1632(auVar10));
          auVar96 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar11));
          auVar94 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar164));
          auVar55._4_4_ = auVar96._4_4_ * auVar164._4_4_;
          auVar55._0_4_ = auVar96._0_4_ * auVar164._0_4_;
          auVar55._8_4_ = auVar96._8_4_ * auVar164._8_4_;
          auVar55._12_4_ = auVar96._12_4_ * auVar164._12_4_;
          auVar55._16_4_ = auVar96._16_4_ * 0.0;
          auVar55._20_4_ = auVar96._20_4_ * 0.0;
          auVar55._24_4_ = auVar96._24_4_ * 0.0;
          auVar55._28_4_ = auVar104._28_4_;
          auVar5 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar11),auVar94);
          auVar56._4_4_ = auVar94._4_4_ * auVar10._4_4_;
          auVar56._0_4_ = auVar94._0_4_ * auVar10._0_4_;
          auVar56._8_4_ = auVar94._8_4_ * auVar10._8_4_;
          auVar56._12_4_ = auVar94._12_4_ * auVar10._12_4_;
          auVar56._16_4_ = auVar94._16_4_ * 0.0;
          auVar56._20_4_ = auVar94._20_4_ * 0.0;
          auVar56._24_4_ = auVar94._24_4_ * 0.0;
          auVar56._28_4_ = auVar94._28_4_;
          auVar6 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar164),auVar98);
          auVar57._4_4_ = auVar11._4_4_ * auVar98._4_4_;
          auVar57._0_4_ = auVar11._0_4_ * auVar98._0_4_;
          auVar57._8_4_ = auVar11._8_4_ * auVar98._8_4_;
          auVar57._12_4_ = auVar11._12_4_ * auVar98._12_4_;
          auVar57._16_4_ = auVar98._16_4_ * 0.0;
          auVar57._20_4_ = auVar98._20_4_ * 0.0;
          auVar57._24_4_ = auVar98._24_4_ * 0.0;
          auVar57._28_4_ = auVar98._28_4_;
          auVar9 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar10),auVar96);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar102,ZEXT1632(auVar6));
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,ZEXT1632(auVar5));
          auVar91 = ZEXT1632(auVar89);
          uVar69 = vcmpps_avx512vl(auVar96,auVar91,2);
          bVar68 = (byte)uVar69;
          fVar177 = (float)((uint)(bVar68 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar136._0_4_);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar85 = (float)((uint)bVar14 * auVar7._4_4_ | (uint)!bVar14 * auVar136._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar130 = (float)((uint)bVar14 * auVar7._8_4_ | (uint)!bVar14 * auVar136._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar132 = (float)((uint)bVar14 * auVar7._12_4_ | (uint)!bVar14 * auVar136._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar85,fVar177))));
          fVar84 = (float)((uint)(bVar68 & 1) * auVar8._0_4_ |
                          (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar129 = (float)((uint)bVar14 * auVar8._4_4_ | (uint)!bVar14 * auVar88._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar131 = (float)((uint)bVar14 * auVar8._8_4_ | (uint)!bVar14 * auVar88._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar133 = (float)((uint)bVar14 * auVar8._12_4_ | (uint)!bVar14 * auVar88._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar84))));
          auVar120._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar165._0_4_);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar165._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar165._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar165._12_4_)
          ;
          fVar154 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar95._16_4_);
          auVar120._16_4_ = fVar154;
          fVar135 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar95._20_4_);
          auVar120._20_4_ = fVar135;
          fVar150 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar95._24_4_);
          auVar120._24_4_ = fVar150;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar95._28_4_;
          auVar120._28_4_ = iVar1;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar103);
          auVar121._0_4_ =
               (uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar5._0_4_;
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar5._4_4_;
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar5._8_4_;
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar5._12_4_;
          auVar121._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_;
          auVar121._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_;
          auVar121._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_;
          auVar121._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar86));
          auVar122._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_
                      );
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar7._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar7._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar7._12_4_);
          fVar151 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
          auVar122._16_4_ = fVar151;
          fVar163 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
          auVar122._20_4_ = fVar163;
          fVar162 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
          auVar122._24_4_ = fVar162;
          auVar122._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar164),ZEXT1632(auVar87));
          auVar123._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
                      );
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar8._4_4_);
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar8._8_4_);
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar8._12_4_);
          fVar175 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
          auVar123._16_4_ = fVar175;
          fVar176 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
          auVar123._20_4_ = fVar176;
          fVar161 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
          auVar123._24_4_ = fVar161;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
          auVar123._28_4_ = iVar2;
          auVar124._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar103._0_4_;
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar14 * (int)auVar10._4_4_ | (uint)!bVar14 * auVar103._4_4_;
          bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar14 * (int)auVar10._8_4_ | (uint)!bVar14 * auVar103._8_4_;
          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar14 * (int)auVar10._12_4_ | (uint)!bVar14 * auVar103._12_4_;
          auVar124._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar103._16_4_;
          auVar124._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar103._20_4_;
          auVar124._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar103._24_4_;
          auVar124._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar103._28_4_;
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar103 = vsubps_avx512vl(auVar124,auVar102);
          auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar11._12_4_ |
                                                  (uint)!bVar18 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar11._8_4_ |
                                                           (uint)!bVar16 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar11._4_4_ |
                                                                    (uint)!bVar14 * auVar86._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar11._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar86._0_4_)))),auVar99);
          auVar188 = ZEXT3264(auVar94);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar164._12_4_ |
                                                  (uint)!bVar19 * auVar87._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar164._8_4_ |
                                                           (uint)!bVar17 * auVar87._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar164._4_4_ |
                                                                    (uint)!bVar15 * auVar87._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar164._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar87._0_4_)))),auVar120);
          auVar104 = vsubps_avx(auVar102,auVar121);
          auVar193 = ZEXT3264(auVar104);
          auVar98 = vsubps_avx(auVar99,auVar122);
          auVar97 = vsubps_avx(auVar120,auVar123);
          auVar58._4_4_ = auVar95._4_4_ * fVar85;
          auVar58._0_4_ = auVar95._0_4_ * fVar177;
          auVar58._8_4_ = auVar95._8_4_ * fVar130;
          auVar58._12_4_ = auVar95._12_4_ * fVar132;
          auVar58._16_4_ = auVar95._16_4_ * 0.0;
          auVar58._20_4_ = auVar95._20_4_ * 0.0;
          auVar58._24_4_ = auVar95._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar58,auVar120,auVar103);
          auVar173._0_4_ = fVar84 * auVar103._0_4_;
          auVar173._4_4_ = fVar129 * auVar103._4_4_;
          auVar173._8_4_ = fVar131 * auVar103._8_4_;
          auVar173._12_4_ = fVar133 * auVar103._12_4_;
          auVar173._16_4_ = auVar103._16_4_ * 0.0;
          auVar173._20_4_ = auVar103._20_4_ * 0.0;
          auVar173._24_4_ = auVar103._24_4_ * 0.0;
          auVar173._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar173,auVar102,auVar94);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar91,ZEXT1632(auVar86));
          auVar181._0_4_ = auVar94._0_4_ * auVar120._0_4_;
          auVar181._4_4_ = auVar94._4_4_ * auVar120._4_4_;
          auVar181._8_4_ = auVar94._8_4_ * auVar120._8_4_;
          auVar181._12_4_ = auVar94._12_4_ * auVar120._12_4_;
          auVar181._16_4_ = auVar94._16_4_ * fVar154;
          auVar181._20_4_ = auVar94._20_4_ * fVar135;
          auVar181._24_4_ = auVar94._24_4_ * fVar150;
          auVar181._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar181,auVar99,auVar95);
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar86));
          auVar96 = vmulps_avx512vl(auVar97,auVar121);
          auVar96 = vfmsub231ps_avx512vl(auVar96,auVar104,auVar123);
          auVar59._4_4_ = auVar98._4_4_ * auVar123._4_4_;
          auVar59._0_4_ = auVar98._0_4_ * auVar123._0_4_;
          auVar59._8_4_ = auVar98._8_4_ * auVar123._8_4_;
          auVar59._12_4_ = auVar98._12_4_ * auVar123._12_4_;
          auVar59._16_4_ = auVar98._16_4_ * fVar175;
          auVar59._20_4_ = auVar98._20_4_ * fVar176;
          auVar59._24_4_ = auVar98._24_4_ * fVar161;
          auVar59._28_4_ = iVar2;
          auVar86 = vfmsub231ps_fma(auVar59,auVar122,auVar97);
          auVar182._0_4_ = auVar122._0_4_ * auVar104._0_4_;
          auVar182._4_4_ = auVar122._4_4_ * auVar104._4_4_;
          auVar182._8_4_ = auVar122._8_4_ * auVar104._8_4_;
          auVar182._12_4_ = auVar122._12_4_ * auVar104._12_4_;
          auVar182._16_4_ = fVar151 * auVar104._16_4_;
          auVar182._20_4_ = fVar163 * auVar104._20_4_;
          auVar182._24_4_ = fVar162 * auVar104._24_4_;
          auVar182._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar182,auVar98,auVar121);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar91,auVar96);
          auVar90 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar86));
          auVar183 = ZEXT3264(auVar90);
          auVar96 = vmaxps_avx(auVar100,auVar90);
          uVar20 = vcmpps_avx512vl(auVar96,auVar91,2);
          bVar81 = bVar81 & (byte)uVar20;
          if (bVar81 != 0) {
            auVar60._4_4_ = auVar97._4_4_ * auVar94._4_4_;
            auVar60._0_4_ = auVar97._0_4_ * auVar94._0_4_;
            auVar60._8_4_ = auVar97._8_4_ * auVar94._8_4_;
            auVar60._12_4_ = auVar97._12_4_ * auVar94._12_4_;
            auVar60._16_4_ = auVar97._16_4_ * auVar94._16_4_;
            auVar60._20_4_ = auVar97._20_4_ * auVar94._20_4_;
            auVar60._24_4_ = auVar97._24_4_ * auVar94._24_4_;
            auVar60._28_4_ = auVar96._28_4_;
            auVar6 = vfmsub231ps_fma(auVar60,auVar98,auVar95);
            auVar61._4_4_ = auVar95._4_4_ * auVar104._4_4_;
            auVar61._0_4_ = auVar95._0_4_ * auVar104._0_4_;
            auVar61._8_4_ = auVar95._8_4_ * auVar104._8_4_;
            auVar61._12_4_ = auVar95._12_4_ * auVar104._12_4_;
            auVar61._16_4_ = auVar95._16_4_ * auVar104._16_4_;
            auVar61._20_4_ = auVar95._20_4_ * auVar104._20_4_;
            auVar61._24_4_ = auVar95._24_4_ * auVar104._24_4_;
            auVar61._28_4_ = auVar95._28_4_;
            auVar5 = vfmsub231ps_fma(auVar61,auVar103,auVar97);
            auVar62._4_4_ = auVar98._4_4_ * auVar103._4_4_;
            auVar62._0_4_ = auVar98._0_4_ * auVar103._0_4_;
            auVar62._8_4_ = auVar98._8_4_ * auVar103._8_4_;
            auVar62._12_4_ = auVar98._12_4_ * auVar103._12_4_;
            auVar62._16_4_ = auVar98._16_4_ * auVar103._16_4_;
            auVar62._20_4_ = auVar98._20_4_ * auVar103._20_4_;
            auVar62._24_4_ = auVar98._24_4_ * auVar103._24_4_;
            auVar62._28_4_ = auVar98._28_4_;
            auVar7 = vfmsub231ps_fma(auVar62,auVar104,auVar94);
            auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar5),ZEXT1632(auVar7));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT1632(auVar6),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar94 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar87),auVar28);
            auVar86 = vfmadd132ps_fma(auVar94,auVar96,auVar96);
            auVar188 = ZEXT1664(auVar86);
            auVar63._4_4_ = auVar7._4_4_ * auVar120._4_4_;
            auVar63._0_4_ = auVar7._0_4_ * auVar120._0_4_;
            auVar63._8_4_ = auVar7._8_4_ * auVar120._8_4_;
            auVar63._12_4_ = auVar7._12_4_ * auVar120._12_4_;
            auVar63._16_4_ = fVar154 * 0.0;
            auVar63._20_4_ = fVar135 * 0.0;
            auVar63._24_4_ = fVar150 * 0.0;
            auVar63._28_4_ = iVar1;
            auVar5 = vfmadd231ps_fma(auVar63,auVar99,ZEXT1632(auVar5));
            auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar102,ZEXT1632(auVar6));
            fVar154 = auVar86._0_4_;
            fVar135 = auVar86._4_4_;
            fVar150 = auVar86._8_4_;
            fVar151 = auVar86._12_4_;
            local_280._28_4_ = auVar96._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar5._12_4_ * fVar151,
                                    CONCAT48(auVar5._8_4_ * fVar150,
                                             CONCAT44(auVar5._4_4_ * fVar135,auVar5._0_4_ * fVar154)
                                            )));
            auVar193 = ZEXT3264(local_280);
            auVar67._4_4_ = uStack_47c;
            auVar67._0_4_ = local_480;
            auVar67._8_4_ = uStack_478;
            auVar67._12_4_ = uStack_474;
            auVar67._16_4_ = uStack_470;
            auVar67._20_4_ = uStack_46c;
            auVar67._24_4_ = uStack_468;
            auVar67._28_4_ = uStack_464;
            uVar20 = vcmpps_avx512vl(local_280,auVar67,0xd);
            uVar152 = *(undefined4 *)(ray + sVar80 * 4 + 0x80);
            auVar29._4_4_ = uVar152;
            auVar29._0_4_ = uVar152;
            auVar29._8_4_ = uVar152;
            auVar29._12_4_ = uVar152;
            auVar29._16_4_ = uVar152;
            auVar29._20_4_ = uVar152;
            auVar29._24_4_ = uVar152;
            auVar29._28_4_ = uVar152;
            uVar21 = vcmpps_avx512vl(local_280,auVar29,2);
            bVar81 = (byte)uVar20 & (byte)uVar21 & bVar81;
            if (bVar81 != 0) {
              uVar82 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar82 = bVar81 & uVar82;
              if ((char)uVar82 != '\0') {
                fVar163 = auVar100._0_4_ * fVar154;
                fVar162 = auVar100._4_4_ * fVar135;
                auVar64._4_4_ = fVar162;
                auVar64._0_4_ = fVar163;
                fVar175 = auVar100._8_4_ * fVar150;
                auVar64._8_4_ = fVar175;
                fVar176 = auVar100._12_4_ * fVar151;
                auVar64._12_4_ = fVar176;
                fVar161 = auVar100._16_4_ * 0.0;
                auVar64._16_4_ = fVar161;
                fVar177 = auVar100._20_4_ * 0.0;
                auVar64._20_4_ = fVar177;
                fVar84 = auVar100._24_4_ * 0.0;
                auVar64._24_4_ = fVar84;
                auVar64._28_4_ = auVar100._28_4_;
                auVar160._8_4_ = 0x3f800000;
                auVar160._0_8_ = 0x3f8000003f800000;
                auVar160._12_4_ = 0x3f800000;
                auVar160._16_4_ = 0x3f800000;
                auVar160._20_4_ = 0x3f800000;
                auVar160._24_4_ = 0x3f800000;
                auVar160._28_4_ = 0x3f800000;
                auVar96 = vsubps_avx(auVar160,auVar64);
                local_2c0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar163 |
                            (uint)!(bool)(bVar68 & 1) * auVar96._0_4_);
                bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar14 * (int)fVar162 | (uint)!bVar14 * auVar96._4_4_);
                bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar14 * (int)fVar175 | (uint)!bVar14 * auVar96._8_4_);
                bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar14 * (int)fVar176 | (uint)!bVar14 * auVar96._12_4_);
                bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar14 * (int)fVar161 | (uint)!bVar14 * auVar96._16_4_);
                bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar14 * (int)fVar177 | (uint)!bVar14 * auVar96._20_4_);
                bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar14 * (int)fVar84 | (uint)!bVar14 * auVar96._24_4_);
                bVar14 = SUB81(uVar69 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar14 * auVar100._28_4_ | (uint)!bVar14 * auVar96._28_4_);
                auVar96 = vsubps_avx(auVar93,auVar92);
                auVar86 = vfmadd213ps_fma(auVar96,local_2c0,auVar92);
                uVar152 = *(undefined4 *)((long)local_558->ray_space + sVar80 * 4 + -0x10);
                auVar30._4_4_ = uVar152;
                auVar30._0_4_ = uVar152;
                auVar30._8_4_ = uVar152;
                auVar30._12_4_ = uVar152;
                auVar30._16_4_ = uVar152;
                auVar30._20_4_ = uVar152;
                auVar30._24_4_ = uVar152;
                auVar30._28_4_ = uVar152;
                auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                             CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                      CONCAT44(auVar86._4_4_ +
                                                                               auVar86._4_4_,
                                                                               auVar86._0_4_ +
                                                                               auVar86._0_4_)))),
                                          auVar30);
                uVar83 = vcmpps_avx512vl(local_280,auVar96,6);
                uVar82 = uVar82 & uVar83;
                bVar81 = (byte)uVar82;
                if (bVar81 != 0) {
                  auVar153._0_4_ = auVar90._0_4_ * fVar154;
                  auVar153._4_4_ = auVar90._4_4_ * fVar135;
                  auVar153._8_4_ = auVar90._8_4_ * fVar150;
                  auVar153._12_4_ = auVar90._12_4_ * fVar151;
                  auVar153._16_4_ = auVar90._16_4_ * 0.0;
                  auVar153._20_4_ = auVar90._20_4_ * 0.0;
                  auVar153._24_4_ = auVar90._24_4_ * 0.0;
                  auVar153._28_4_ = 0;
                  auVar174._8_4_ = 0x3f800000;
                  auVar174._0_8_ = 0x3f8000003f800000;
                  auVar174._12_4_ = 0x3f800000;
                  auVar174._16_4_ = 0x3f800000;
                  auVar174._20_4_ = 0x3f800000;
                  auVar174._24_4_ = 0x3f800000;
                  auVar174._28_4_ = 0x3f800000;
                  auVar96 = vsubps_avx(auVar174,auVar153);
                  auVar125._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar153._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
                  bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar125._4_4_ =
                       (uint)bVar14 * (int)auVar153._4_4_ | (uint)!bVar14 * auVar96._4_4_;
                  bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar125._8_4_ =
                       (uint)bVar14 * (int)auVar153._8_4_ | (uint)!bVar14 * auVar96._8_4_;
                  bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar125._12_4_ =
                       (uint)bVar14 * (int)auVar153._12_4_ | (uint)!bVar14 * auVar96._12_4_;
                  bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar125._16_4_ =
                       (uint)bVar14 * (int)auVar153._16_4_ | (uint)!bVar14 * auVar96._16_4_;
                  bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar125._20_4_ =
                       (uint)bVar14 * (int)auVar153._20_4_ | (uint)!bVar14 * auVar96._20_4_;
                  bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar125._24_4_ =
                       (uint)bVar14 * (int)auVar153._24_4_ | (uint)!bVar14 * auVar96._24_4_;
                  auVar125._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar125,auVar174,auVar31);
                  local_260 = (int)lVar76;
                  local_25c = iVar77;
                  local_250 = local_5b0._0_8_;
                  uStack_248 = local_5b0._8_8_;
                  local_240 = local_5d0._0_8_;
                  uStack_238 = local_5d0._8_8_;
                  local_230 = local_5e0._0_8_;
                  uStack_228 = local_5e0._8_8_;
                  local_220 = local_5c0;
                  uStack_218 = uStack_5b8;
                  pGVar75 = (context->scene->geometries).items[local_5f0].ptr;
                  if ((pGVar75->mask & *(uint *)(ray + sVar80 * 4 + 0x90)) != 0) {
                    auVar86 = vcvtsi2ss_avx512f(auVar89,(int)lVar76);
                    fVar154 = auVar86._0_4_;
                    local_200[0] = (fVar154 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar154 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar154 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar154 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar154 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar154 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar154 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar154 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar145._8_4_ = 0x7f800000;
                    auVar145._0_8_ = 0x7f8000007f800000;
                    auVar145._12_4_ = 0x7f800000;
                    auVar145._16_4_ = 0x7f800000;
                    auVar145._20_4_ = 0x7f800000;
                    auVar145._24_4_ = 0x7f800000;
                    auVar145._28_4_ = 0x7f800000;
                    auVar96 = vblendmps_avx512vl(auVar145,local_280);
                    auVar126._0_4_ =
                         (uint)(bVar81 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000
                    ;
                    bVar14 = (bool)((byte)(uVar82 >> 1) & 1);
                    auVar126._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar82 >> 2) & 1);
                    auVar126._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar82 >> 3) & 1);
                    auVar126._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar82 >> 4) & 1);
                    auVar126._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar82 >> 5) & 1);
                    auVar126._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                    auVar126._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar82 >> 7,0);
                    auVar126._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar96 = vshufps_avx(auVar126,auVar126,0xb1);
                    auVar96 = vminps_avx(auVar126,auVar96);
                    auVar94 = vshufpd_avx(auVar96,auVar96,5);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    auVar94 = vpermpd_avx2(auVar96,0x4e);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    uVar20 = vcmpps_avx512vl(auVar126,auVar96,0);
                    uVar71 = (uint)uVar82;
                    if ((bVar81 & (byte)uVar20) != 0) {
                      uVar71 = (uint)(bVar81 & (byte)uVar20);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar69 = (ulong)uVar72;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar210._0_32_);
                      local_570 = ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x80));
                      local_540._0_8_ = pGVar75;
                      local_5e4 = iVar77;
                      local_520 = local_280;
                      do {
                        local_420 = local_200[uVar69];
                        local_410 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                        *(undefined4 *)(ray + sVar80 * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar69 * 4);
                        local_5a0.context = context->user;
                        fVar135 = 1.0 - local_420;
                        fVar154 = fVar135 * fVar135 * -3.0;
                        auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                  ZEXT416((uint)(local_420 * fVar135)),
                                                  ZEXT416(0xc0000000));
                        auVar87 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar135)),
                                                  ZEXT416((uint)(local_420 * local_420)),
                                                  ZEXT416(0x40000000));
                        fVar135 = auVar86._0_4_ * 3.0;
                        fVar150 = auVar87._0_4_ * 3.0;
                        fVar151 = local_420 * local_420 * 3.0;
                        auVar186._0_4_ = fVar151 * (float)local_5c0._0_4_;
                        auVar186._4_4_ = fVar151 * (float)local_5c0._4_4_;
                        auVar186._8_4_ = fVar151 * (float)uStack_5b8;
                        auVar186._12_4_ = fVar151 * uStack_5b8._4_4_;
                        auVar188 = ZEXT1664(auVar186);
                        auVar137._4_4_ = fVar150;
                        auVar137._0_4_ = fVar150;
                        auVar137._8_4_ = fVar150;
                        auVar137._12_4_ = fVar150;
                        auVar86 = vfmadd132ps_fma(auVar137,auVar186,local_5e0);
                        auVar168._4_4_ = fVar135;
                        auVar168._0_4_ = fVar135;
                        auVar168._8_4_ = fVar135;
                        auVar168._12_4_ = fVar135;
                        auVar86 = vfmadd132ps_fma(auVar168,auVar86,local_5d0);
                        auVar138._4_4_ = fVar154;
                        auVar138._0_4_ = fVar154;
                        auVar138._8_4_ = fVar154;
                        auVar138._12_4_ = fVar154;
                        auVar86 = vfmadd132ps_fma(auVar138,auVar86,local_5b0);
                        local_450 = auVar86._0_4_;
                        local_440 = vshufps_avx(auVar86,auVar86,0x55);
                        auVar183 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar86,auVar86,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_4e0._0_8_;
                        uStack_3f8 = local_4e0._8_8_;
                        local_3f0 = local_4d0;
                        vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                        uStack_3dc = (local_5a0.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_5a0.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_610 = local_4f0;
                        local_5a0.valid = (int *)local_610;
                        local_5a0.geometryUserPtr = pGVar75->userPtr;
                        local_5a0.hit = (RTCHitN *)&local_450;
                        local_5a0.N = 4;
                        local_5a0.ray = (RTCRayN *)ray;
                        if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar183 = ZEXT1664(local_440);
                          auVar188 = ZEXT1664(auVar186);
                          (*pGVar75->intersectionFilterN)(&local_5a0);
                          auVar193 = ZEXT3264(local_520);
                          pGVar75 = (Geometry *)local_540._0_8_;
                        }
                        uVar83 = vptestmd_avx512vl(local_610,local_610);
                        if ((uVar83 & 0xf) == 0) {
LAB_01a1e336:
                          *(undefined4 *)(ray + sVar80 * 4 + 0x80) = local_570._0_4_;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar183 = ZEXT1664(auVar183._0_16_);
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            (*p_Var13)(&local_5a0);
                            auVar193 = ZEXT3264(local_520);
                            pGVar75 = (Geometry *)local_540._0_8_;
                          }
                          uVar83 = vptestmd_avx512vl(local_610,local_610);
                          uVar83 = uVar83 & 0xf;
                          bVar81 = (byte)uVar83;
                          if (bVar81 == 0) goto LAB_01a1e336;
                          iVar77 = *(int *)(local_5a0.hit + 4);
                          iVar1 = *(int *)(local_5a0.hit + 8);
                          iVar2 = *(int *)(local_5a0.hit + 0xc);
                          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar16 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xc0) =
                               (uint)(bVar81 & 1) * *(int *)local_5a0.hit |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xc0);
                          *(uint *)(local_5a0.ray + 0xc4) =
                               (uint)bVar14 * iVar77 |
                               (uint)!bVar14 * *(int *)(local_5a0.ray + 0xc4);
                          *(uint *)(local_5a0.ray + 200) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_5a0.ray + 200);
                          *(uint *)(local_5a0.ray + 0xcc) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xcc)
                          ;
                          iVar77 = *(int *)(local_5a0.hit + 0x14);
                          iVar1 = *(int *)(local_5a0.hit + 0x18);
                          iVar2 = *(int *)(local_5a0.hit + 0x1c);
                          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar16 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xd0) =
                               (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x10) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xd0);
                          *(uint *)(local_5a0.ray + 0xd4) =
                               (uint)bVar14 * iVar77 |
                               (uint)!bVar14 * *(int *)(local_5a0.ray + 0xd4);
                          *(uint *)(local_5a0.ray + 0xd8) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0xd8)
                          ;
                          *(uint *)(local_5a0.ray + 0xdc) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xdc)
                          ;
                          iVar77 = *(int *)(local_5a0.hit + 0x24);
                          iVar1 = *(int *)(local_5a0.hit + 0x28);
                          iVar2 = *(int *)(local_5a0.hit + 0x2c);
                          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar16 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xe0) =
                               (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x20) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xe0);
                          *(uint *)(local_5a0.ray + 0xe4) =
                               (uint)bVar14 * iVar77 |
                               (uint)!bVar14 * *(int *)(local_5a0.ray + 0xe4);
                          *(uint *)(local_5a0.ray + 0xe8) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0xe8)
                          ;
                          *(uint *)(local_5a0.ray + 0xec) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xec)
                          ;
                          iVar77 = *(int *)(local_5a0.hit + 0x34);
                          iVar1 = *(int *)(local_5a0.hit + 0x38);
                          iVar2 = *(int *)(local_5a0.hit + 0x3c);
                          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar16 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xf0) =
                               (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x30) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0xf0);
                          *(uint *)(local_5a0.ray + 0xf4) =
                               (uint)bVar14 * iVar77 |
                               (uint)!bVar14 * *(int *)(local_5a0.ray + 0xf4);
                          *(uint *)(local_5a0.ray + 0xf8) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_5a0.ray + 0xf8)
                          ;
                          *(uint *)(local_5a0.ray + 0xfc) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_5a0.ray + 0xfc)
                          ;
                          iVar77 = *(int *)(local_5a0.hit + 0x44);
                          iVar1 = *(int *)(local_5a0.hit + 0x48);
                          iVar2 = *(int *)(local_5a0.hit + 0x4c);
                          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
                          bVar16 = SUB81(uVar83 >> 3,0);
                          *(uint *)(local_5a0.ray + 0x100) =
                               (uint)(bVar81 & 1) * *(int *)(local_5a0.hit + 0x40) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_5a0.ray + 0x100);
                          *(uint *)(local_5a0.ray + 0x104) =
                               (uint)bVar14 * iVar77 |
                               (uint)!bVar14 * *(int *)(local_5a0.ray + 0x104);
                          *(uint *)(local_5a0.ray + 0x108) =
                               (uint)bVar15 * iVar1 |
                               (uint)!bVar15 * *(int *)(local_5a0.ray + 0x108);
                          *(uint *)(local_5a0.ray + 0x10c) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_5a0.ray + 0x10c);
                          auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar86;
                          auVar86 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar86;
                          auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar86;
                          auVar86 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar86;
                          local_570._0_4_ = *(undefined4 *)(ray + sVar80 * 4 + 0x80);
                          local_570._4_4_ = 0;
                          local_570._8_4_ = 0;
                          local_570._12_4_ = 0;
                        }
                        bVar81 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar82;
                        auVar146._4_4_ = local_570._0_4_;
                        auVar146._0_4_ = local_570._0_4_;
                        auVar146._8_4_ = local_570._0_4_;
                        auVar146._12_4_ = local_570._0_4_;
                        auVar146._16_4_ = local_570._0_4_;
                        auVar146._20_4_ = local_570._0_4_;
                        auVar146._24_4_ = local_570._0_4_;
                        auVar146._28_4_ = local_570._0_4_;
                        uVar20 = vcmpps_avx512vl(auVar193._0_32_,auVar146,2);
                        if ((bVar81 & (byte)uVar20) == 0) goto LAB_01a1e3d6;
                        bVar81 = bVar81 & (byte)uVar20;
                        uVar82 = (ulong)bVar81;
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar96 = vblendmps_avx512vl(auVar147,auVar193._0_32_);
                        auVar127._0_4_ =
                             (uint)(bVar81 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar81 >> 1 & 1);
                        auVar127._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar81 >> 2 & 1);
                        auVar127._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar81 >> 3 & 1);
                        auVar127._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar81 >> 4 & 1);
                        auVar127._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar81 >> 5 & 1);
                        auVar127._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar81 >> 6 & 1);
                        auVar127._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        auVar127._28_4_ =
                             (uint)(bVar81 >> 7) * auVar96._28_4_ |
                             (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                        auVar96 = vshufps_avx(auVar127,auVar127,0xb1);
                        auVar96 = vminps_avx(auVar127,auVar96);
                        auVar94 = vshufpd_avx(auVar96,auVar96,5);
                        auVar96 = vminps_avx(auVar96,auVar94);
                        auVar94 = vpermpd_avx2(auVar96,0x4e);
                        auVar96 = vminps_avx(auVar96,auVar94);
                        uVar20 = vcmpps_avx512vl(auVar127,auVar96,0);
                        bVar68 = (byte)uVar20 & bVar81;
                        if (bVar68 != 0) {
                          bVar81 = bVar68;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar81; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar69 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar154 = local_200[uVar69];
                    uVar152 = *(undefined4 *)(local_1e0 + uVar69 * 4);
                    fVar150 = 1.0 - fVar154;
                    fVar135 = fVar150 * fVar150 * -3.0;
                    auVar183 = ZEXT464((uint)fVar135);
                    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),
                                              ZEXT416((uint)(fVar154 * fVar150)),ZEXT416(0xc0000000)
                                             );
                    auVar87 = vfmsub132ss_fma(ZEXT416((uint)(fVar154 * fVar150)),
                                              ZEXT416((uint)(fVar154 * fVar154)),ZEXT416(0x40000000)
                                             );
                    fVar150 = auVar86._0_4_ * 3.0;
                    fVar151 = auVar87._0_4_ * 3.0;
                    fVar163 = fVar154 * fVar154 * 3.0;
                    auVar185._0_4_ = fVar163 * (float)local_5c0._0_4_;
                    auVar185._4_4_ = fVar163 * (float)local_5c0._4_4_;
                    auVar185._8_4_ = fVar163 * (float)uStack_5b8;
                    auVar185._12_4_ = fVar163 * uStack_5b8._4_4_;
                    auVar188 = ZEXT1664(auVar185);
                    auVar157._4_4_ = fVar151;
                    auVar157._0_4_ = fVar151;
                    auVar157._8_4_ = fVar151;
                    auVar157._12_4_ = fVar151;
                    auVar86 = vfmadd132ps_fma(auVar157,auVar185,local_5e0);
                    auVar167._4_4_ = fVar150;
                    auVar167._0_4_ = fVar150;
                    auVar167._8_4_ = fVar150;
                    auVar167._12_4_ = fVar150;
                    auVar86 = vfmadd132ps_fma(auVar167,auVar86,local_5d0);
                    auVar158._4_4_ = fVar135;
                    auVar158._0_4_ = fVar135;
                    auVar158._8_4_ = fVar135;
                    auVar158._12_4_ = fVar135;
                    auVar86 = vfmadd132ps_fma(auVar158,auVar86,local_5b0);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x80) =
                         *(undefined4 *)(local_1c0 + uVar69 * 4);
                    *(int *)(ray + sVar80 * 4 + 0xc0) = auVar86._0_4_;
                    uVar12 = vextractps_avx(auVar86,1);
                    *(undefined4 *)(ray + sVar80 * 4 + 0xd0) = uVar12;
                    uVar12 = vextractps_avx(auVar86,2);
                    *(undefined4 *)(ray + sVar80 * 4 + 0xe0) = uVar12;
                    *(float *)(ray + sVar80 * 4 + 0xf0) = fVar154;
                    *(undefined4 *)(ray + sVar80 * 4 + 0x100) = uVar152;
                    *(int *)(ray + sVar80 * 4 + 0x110) = (int)local_550;
                    *(int *)(ray + sVar80 * 4 + 0x120) = (int)local_5f0;
                    *(uint *)(ray + sVar80 * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + sVar80 * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a1e035;
      }
    }
    uVar152 = *(undefined4 *)(ray + sVar80 * 4 + 0x80);
    auVar27._4_4_ = uVar152;
    auVar27._0_4_ = uVar152;
    auVar27._8_4_ = uVar152;
    auVar27._12_4_ = uVar152;
    auVar27._16_4_ = uVar152;
    auVar27._20_4_ = uVar152;
    auVar27._24_4_ = uVar152;
    auVar27._28_4_ = uVar152;
    uVar20 = vcmpps_avx512vl(local_80,auVar27,2);
    uVar78 = (ulong)((uint)uVar78 & (uint)uVar78 + 0xff & (uint)uVar20);
  } while( true );
LAB_01a1e3d6:
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar209 = ZEXT3264(auVar96);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar211 = ZEXT1664(auVar86);
  auVar212 = ZEXT3264(local_4c0);
  auVar96 = vmovdqa64_avx512vl(local_140);
  auVar210 = ZEXT3264(auVar96);
  prim = local_5f8;
  iVar77 = local_5e4;
LAB_01a1e035:
  lVar76 = lVar76 + 8;
  goto LAB_01a1d775;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }